

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  Primitive PVar11;
  int iVar12;
  RTCFilterFunctionN p_Var13;
  code *pcVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [28];
  byte bVar90;
  uint uVar91;
  ulong uVar92;
  Geometry *pGVar93;
  Geometry *geometry;
  long lVar94;
  ulong uVar95;
  bool bVar96;
  ulong uVar97;
  undefined4 uVar98;
  undefined8 uVar99;
  float fVar116;
  vint4 bi_2;
  undefined1 auVar105 [16];
  undefined1 auVar100 [16];
  float fVar115;
  float fVar117;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar104 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  vint4 bi_1;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vint4 ai_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  vint4 ai;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 bi;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [64];
  float fVar173;
  float fVar178;
  float fVar179;
  vint4 ai_1;
  undefined1 auVar184 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar183 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar181;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar190;
  float fVar191;
  undefined1 auVar189 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined4 uVar195;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  float fVar205;
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  float fVar206;
  float fVar211;
  undefined1 auVar207 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  RTCFilterFunctionNArguments args;
  int local_76c;
  Primitive *local_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  ulong local_670;
  Precalculations *local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined4 local_518;
  float local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  uint local_504;
  uint local_500;
  ulong local_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  int iStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar182 [16];
  undefined1 auVar208 [16];
  
  local_668 = pre;
  PVar11 = prim[1];
  uVar97 = (ulong)(byte)PVar11;
  fVar132 = *(float *)(prim + uVar97 * 0x19 + 0x12);
  auVar20 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar97 * 0x19 + 6));
  auVar100._0_4_ = fVar132 * auVar20._0_4_;
  auVar100._4_4_ = fVar132 * auVar20._4_4_;
  auVar100._8_4_ = fVar132 * auVar20._8_4_;
  auVar100._12_4_ = fVar132 * auVar20._12_4_;
  auVar154._0_4_ = fVar132 * (ray->dir).field_0.m128[0];
  auVar154._4_4_ = fVar132 * (ray->dir).field_0.m128[1];
  auVar154._8_4_ = fVar132 * (ray->dir).field_0.m128[2];
  auVar154._12_4_ = fVar132 * (ray->dir).field_0.m128[3];
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar11 * 0xc + uVar97 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar92 = (ulong)(uint)((int)(uVar97 * 9) * 2);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + uVar97 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar92 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar207._4_4_ = auVar154._0_4_;
  auVar207._0_4_ = auVar154._0_4_;
  auVar207._8_4_ = auVar154._0_4_;
  auVar207._12_4_ = auVar154._0_4_;
  auVar122 = vshufps_avx(auVar154,auVar154,0x55);
  auVar101 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar132 = auVar101._0_4_;
  auVar196._0_4_ = fVar132 * auVar17._0_4_;
  fVar115 = auVar101._4_4_;
  auVar196._4_4_ = fVar115 * auVar17._4_4_;
  fVar116 = auVar101._8_4_;
  auVar196._8_4_ = fVar116 * auVar17._8_4_;
  fVar117 = auVar101._12_4_;
  auVar196._12_4_ = fVar117 * auVar17._12_4_;
  auVar192._0_4_ = auVar19._0_4_ * fVar132;
  auVar192._4_4_ = auVar19._4_4_ * fVar115;
  auVar192._8_4_ = auVar19._8_4_ * fVar116;
  auVar192._12_4_ = auVar19._12_4_ * fVar117;
  auVar174._0_4_ = auVar133._0_4_ * fVar132;
  auVar174._4_4_ = auVar133._4_4_ * fVar115;
  auVar174._8_4_ = auVar133._8_4_ * fVar116;
  auVar174._12_4_ = auVar133._12_4_ * fVar117;
  auVar101 = vfmadd231ps_fma(auVar196,auVar122,auVar16);
  auVar123 = vfmadd231ps_fma(auVar192,auVar122,auVar105);
  auVar122 = vfmadd231ps_fma(auVar174,auVar102,auVar122);
  auVar141 = vfmadd231ps_fma(auVar101,auVar207,auVar20);
  auVar123 = vfmadd231ps_fma(auVar123,auVar207,auVar18);
  auVar194 = ZEXT1664(auVar123);
  auVar147 = vfmadd231ps_fma(auVar122,auVar103,auVar207);
  auVar208._4_4_ = auVar100._0_4_;
  auVar208._0_4_ = auVar100._0_4_;
  auVar208._8_4_ = auVar100._0_4_;
  auVar208._12_4_ = auVar100._0_4_;
  auVar210 = ZEXT1664(auVar208);
  auVar122 = vshufps_avx(auVar100,auVar100,0x55);
  auVar101 = vshufps_avx(auVar100,auVar100,0xaa);
  fVar132 = auVar101._0_4_;
  auVar155._0_4_ = fVar132 * auVar17._0_4_;
  fVar115 = auVar101._4_4_;
  auVar155._4_4_ = fVar115 * auVar17._4_4_;
  fVar116 = auVar101._8_4_;
  auVar155._8_4_ = fVar116 * auVar17._8_4_;
  fVar117 = auVar101._12_4_;
  auVar155._12_4_ = fVar117 * auVar17._12_4_;
  auVar121._0_4_ = auVar19._0_4_ * fVar132;
  auVar121._4_4_ = auVar19._4_4_ * fVar115;
  auVar121._8_4_ = auVar19._8_4_ * fVar116;
  auVar121._12_4_ = auVar19._12_4_ * fVar117;
  auVar101._0_4_ = auVar133._0_4_ * fVar132;
  auVar101._4_4_ = auVar133._4_4_ * fVar115;
  auVar101._8_4_ = auVar133._8_4_ * fVar116;
  auVar101._12_4_ = auVar133._12_4_ * fVar117;
  auVar16 = vfmadd231ps_fma(auVar155,auVar122,auVar16);
  auVar17 = vfmadd231ps_fma(auVar121,auVar122,auVar105);
  auVar105 = vfmadd231ps_fma(auVar101,auVar122,auVar102);
  auVar19 = vfmadd231ps_fma(auVar16,auVar208,auVar20);
  auVar102 = vfmadd231ps_fma(auVar17,auVar208,auVar18);
  auVar133 = vfmadd231ps_fma(auVar105,auVar208,auVar103);
  local_270._8_4_ = 0x7fffffff;
  local_270._0_8_ = 0x7fffffff7fffffff;
  local_270._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx(auVar141,local_270);
  auVar146._8_4_ = 0x219392ef;
  auVar146._0_8_ = 0x219392ef219392ef;
  auVar146._12_4_ = 0x219392ef;
  auVar20 = vcmpps_avx(auVar20,auVar146,1);
  auVar16 = vblendvps_avx(auVar141,auVar146,auVar20);
  auVar20 = vandps_avx(auVar123,local_270);
  auVar20 = vcmpps_avx(auVar20,auVar146,1);
  auVar17 = vblendvps_avx(auVar123,auVar146,auVar20);
  auVar20 = vandps_avx(auVar147,local_270);
  auVar20 = vcmpps_avx(auVar20,auVar146,1);
  auVar20 = vblendvps_avx(auVar147,auVar146,auVar20);
  auVar18 = vrcpps_avx(auVar16);
  auVar170._8_4_ = 0x3f800000;
  auVar170._0_8_ = 0x3f8000003f800000;
  auVar170._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar170);
  auVar18 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar17);
  auVar17 = vfnmadd213ps_fma(auVar17,auVar16,auVar170);
  auVar105 = vfmadd132ps_fma(auVar17,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar16,auVar170);
  auVar103 = vfmadd132ps_fma(auVar20,auVar16,auVar16);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar147._0_4_ = auVar18._0_4_ * auVar20._0_4_;
  auVar147._4_4_ = auVar18._4_4_ * auVar20._4_4_;
  auVar147._8_4_ = auVar18._8_4_ * auVar20._8_4_;
  auVar147._12_4_ = auVar18._12_4_ * auVar20._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar16);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar156._0_4_ = auVar18._0_4_ * auVar20._0_4_;
  auVar156._4_4_ = auVar18._4_4_ * auVar20._4_4_;
  auVar156._8_4_ = auVar18._8_4_ * auVar20._8_4_;
  auVar156._12_4_ = auVar18._12_4_ * auVar20._12_4_;
  auVar123._1_3_ = 0;
  auVar123[0] = PVar11;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar97 * -2 + 6);
  auVar20 = vpmovsxwd_avx(auVar18);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar102);
  auVar175._0_4_ = auVar20._0_4_ * auVar105._0_4_;
  auVar175._4_4_ = auVar20._4_4_ * auVar105._4_4_;
  auVar175._8_4_ = auVar20._8_4_ * auVar105._8_4_;
  auVar175._12_4_ = auVar20._12_4_ * auVar105._12_4_;
  auVar20 = vcvtdq2ps_avx(auVar16);
  auVar20 = vsubps_avx(auVar20,auVar102);
  auVar122._0_4_ = auVar105._0_4_ * auVar20._0_4_;
  auVar122._4_4_ = auVar105._4_4_ * auVar20._4_4_;
  auVar122._8_4_ = auVar105._8_4_ * auVar20._8_4_;
  auVar122._12_4_ = auVar105._12_4_ * auVar20._12_4_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar92 + uVar97 + 6);
  auVar20 = vpmovsxwd_avx(auVar105);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar133);
  auVar141._0_4_ = auVar103._0_4_ * auVar20._0_4_;
  auVar141._4_4_ = auVar103._4_4_ * auVar20._4_4_;
  auVar141._8_4_ = auVar103._8_4_ * auVar20._8_4_;
  auVar141._12_4_ = auVar103._12_4_ * auVar20._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar97 * 0x17 + 6);
  auVar20 = vpmovsxwd_avx(auVar19);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar133);
  auVar102._0_4_ = auVar103._0_4_ * auVar20._0_4_;
  auVar102._4_4_ = auVar103._4_4_ * auVar20._4_4_;
  auVar102._8_4_ = auVar103._8_4_ * auVar20._8_4_;
  auVar102._12_4_ = auVar103._12_4_ * auVar20._12_4_;
  auVar20 = vpminsd_avx(auVar147,auVar156);
  auVar16 = vpminsd_avx(auVar175,auVar122);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  auVar16 = vpminsd_avx(auVar141,auVar102);
  uVar98 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar182._4_4_ = uVar98;
  auVar182._0_4_ = uVar98;
  auVar182._8_4_ = uVar98;
  auVar182._12_4_ = uVar98;
  auVar189 = ZEXT1664(auVar182);
  auVar16 = vmaxps_avx(auVar16,auVar182);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  local_280._0_4_ = auVar20._0_4_ * 0.99999964;
  local_280._4_4_ = auVar20._4_4_ * 0.99999964;
  local_280._8_4_ = auVar20._8_4_ * 0.99999964;
  local_280._12_4_ = auVar20._12_4_ * 0.99999964;
  auVar20 = vpmaxsd_avx(auVar147,auVar156);
  auVar16 = vpmaxsd_avx(auVar175,auVar122);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar16 = vpmaxsd_avx(auVar141,auVar102);
  fVar132 = ray->tfar;
  auVar133._4_4_ = fVar132;
  auVar133._0_4_ = fVar132;
  auVar133._8_4_ = fVar132;
  auVar133._12_4_ = fVar132;
  auVar16 = vminps_avx(auVar16,auVar133);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar103._0_4_ = auVar20._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar20._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar20._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar20._12_4_ * 1.0000004;
  auVar123[4] = PVar11;
  auVar123._5_3_ = 0;
  auVar123[8] = PVar11;
  auVar123._9_3_ = 0;
  auVar123[0xc] = PVar11;
  auVar123._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar123,_DAT_01f7fcf0);
  auVar20 = vcmpps_avx(local_280,auVar103,2);
  auVar20 = vandps_avx(auVar20,auVar16);
  uVar91 = vmovmskps_avx(auVar20);
  if (uVar91 == 0) {
    bVar96 = false;
  }
  else {
    uVar91 = uVar91 & 0xff;
    local_480 = mm_lookupmask_ps._16_8_;
    uStack_478 = mm_lookupmask_ps._24_8_;
    uStack_470 = mm_lookupmask_ps._16_8_;
    uStack_468 = mm_lookupmask_ps._24_8_;
    local_768 = prim;
    do {
      auVar129 = local_420;
      local_6c0 = auVar194._0_32_;
      auVar184 = auVar189._0_32_;
      auVar113 = auVar210._0_32_;
      lVar23 = 0;
      uVar97 = (ulong)uVar91;
      for (uVar92 = uVar97; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      local_670 = (ulong)*(uint *)(local_768 + 2);
      pGVar93 = (context->scene->geometries).items[*(uint *)(local_768 + 2)].ptr;
      local_4e8 = (ulong)*(uint *)(local_768 + lVar23 * 4 + 6);
      uVar92 = (ulong)*(uint *)(*(long *)&pGVar93->field_0x58 +
                               pGVar93[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(local_768 + lVar23 * 4 + 6));
      p_Var13 = pGVar93[1].intersectionFilterN;
      lVar23 = *(long *)&pGVar93[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar23 + (long)p_Var13 * uVar92);
      local_5e0 = *(undefined8 *)*pauVar1;
      uStack_5d8 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar23 + (uVar92 + 1) * (long)p_Var13);
      local_5f0 = *(undefined8 *)*pauVar2;
      uStack_5e8 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar23 + (uVar92 + 2) * (long)p_Var13);
      local_600 = *(undefined8 *)*pauVar3;
      uStack_5f8 = *(undefined8 *)(*pauVar3 + 8);
      uVar97 = uVar97 - 1 & uVar97;
      pauVar4 = (undefined1 (*) [12])(lVar23 + (uVar92 + 3) * (long)p_Var13);
      local_490 = (float)*(undefined8 *)*pauVar4;
      fStack_48c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_488 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_484 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar97 != 0) {
        uVar95 = uVar97 - 1 & uVar97;
        for (uVar92 = uVar97; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
        }
        if (uVar95 != 0) {
          for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar12 = (int)pGVar93[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar7 = (ray->org).field_0;
      auVar16 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
      uVar98 = auVar16._0_4_;
      auVar142._4_4_ = uVar98;
      auVar142._0_4_ = uVar98;
      auVar142._8_4_ = uVar98;
      auVar142._12_4_ = uVar98;
      auVar20 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      aVar8 = (local_668->ray_space).vx.field_0;
      aVar9 = (local_668->ray_space).vy.field_0;
      fVar132 = (local_668->ray_space).vz.field_0.m128[0];
      fVar115 = (local_668->ray_space).vz.field_0.m128[1];
      fVar116 = (local_668->ray_space).vz.field_0.m128[2];
      fVar117 = (local_668->ray_space).vz.field_0.m128[3];
      auVar157._0_4_ = auVar16._0_4_ * fVar132;
      auVar157._4_4_ = auVar16._4_4_ * fVar115;
      auVar157._8_4_ = auVar16._8_4_ * fVar116;
      auVar157._12_4_ = auVar16._12_4_ * fVar117;
      auVar20 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar9,auVar20);
      auVar19 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar8,auVar142);
      auVar20 = vblendps_avx(auVar19,*pauVar1,8);
      auVar17 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
      uVar98 = auVar17._0_4_;
      auVar158._4_4_ = uVar98;
      auVar158._0_4_ = uVar98;
      auVar158._8_4_ = uVar98;
      auVar158._12_4_ = uVar98;
      auVar16 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar183._0_4_ = auVar17._0_4_ * fVar132;
      auVar183._4_4_ = auVar17._4_4_ * fVar115;
      auVar183._8_4_ = auVar17._8_4_ * fVar116;
      auVar183._12_4_ = auVar17._12_4_ * fVar117;
      auVar16 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar9,auVar16);
      auVar103 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar8,auVar158);
      auVar16 = vblendps_avx(auVar103,*pauVar2,8);
      auVar18 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
      uVar98 = auVar18._0_4_;
      auVar164._4_4_ = uVar98;
      auVar164._0_4_ = uVar98;
      auVar164._8_4_ = uVar98;
      auVar164._12_4_ = uVar98;
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar197._0_4_ = auVar18._0_4_ * fVar132;
      auVar197._4_4_ = auVar18._4_4_ * fVar115;
      auVar197._8_4_ = auVar18._8_4_ * fVar116;
      auVar197._12_4_ = auVar18._12_4_ * fVar117;
      auVar17 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar9,auVar17);
      auVar102 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar8,auVar164);
      auVar17 = vblendps_avx(auVar102,*pauVar3,8);
      auVar86._12_4_ = fStack_484;
      auVar86._0_12_ = *pauVar4;
      local_660._0_16_ = (undefined1  [16])aVar7;
      auVar105 = vsubps_avx(auVar86,(undefined1  [16])aVar7);
      uVar98 = auVar105._0_4_;
      auVar171._4_4_ = uVar98;
      auVar171._0_4_ = uVar98;
      auVar171._8_4_ = uVar98;
      auVar171._12_4_ = uVar98;
      auVar18 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar201._0_4_ = auVar105._0_4_ * fVar132;
      auVar201._4_4_ = auVar105._4_4_ * fVar115;
      auVar201._8_4_ = auVar105._8_4_ * fVar116;
      auVar201._12_4_ = auVar105._12_4_ * fVar117;
      auVar18 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar9,auVar18);
      auVar133 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar8,auVar171);
      auVar18 = vblendps_avx(auVar133,auVar86,8);
      auVar20 = vandps_avx(auVar20,local_270);
      auVar16 = vandps_avx(auVar16,local_270);
      auVar105 = vmaxps_avx(auVar20,auVar16);
      auVar20 = vandps_avx(auVar17,local_270);
      auVar16 = vandps_avx(auVar18,local_270);
      auVar20 = vmaxps_avx(auVar20,auVar16);
      auVar20 = vmaxps_avx(auVar105,auVar20);
      auVar16 = vmovshdup_avx(auVar20);
      auVar16 = vmaxss_avx(auVar16,auVar20);
      auVar20 = vshufpd_avx(auVar20,auVar20,1);
      auVar20 = vmaxss_avx(auVar20,auVar16);
      lVar23 = (long)iVar12 * 0x44;
      auVar16 = vmovshdup_avx(auVar19);
      uVar99 = auVar16._0_8_;
      local_400._8_8_ = uVar99;
      local_400._0_8_ = uVar99;
      local_400._16_8_ = uVar99;
      local_400._24_8_ = uVar99;
      auVar16 = vmovshdup_avx(auVar103);
      uVar99 = auVar16._0_8_;
      local_2a0._8_8_ = uVar99;
      local_2a0._0_8_ = uVar99;
      local_2a0._16_8_ = uVar99;
      local_2a0._24_8_ = uVar99;
      auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x908);
      uVar195 = auVar102._0_4_;
      local_6a0._4_4_ = uVar195;
      local_6a0._0_4_ = uVar195;
      local_6a0._8_4_ = uVar195;
      local_6a0._12_4_ = uVar195;
      local_6a0._16_4_ = uVar195;
      local_6a0._20_4_ = uVar195;
      local_6a0._24_4_ = uVar195;
      local_6a0._28_4_ = uVar195;
      auVar16 = vmovshdup_avx(auVar102);
      uVar99 = auVar16._0_8_;
      local_560._8_8_ = uVar99;
      local_560._0_8_ = uVar99;
      local_560._16_8_ = uVar99;
      local_560._24_8_ = uVar99;
      local_320 = *(float *)(catmullrom_basis0 + lVar23 + 0xd8c);
      fStack_31c = *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      fStack_318 = *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      fStack_314 = *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      fStack_310 = *(float *)(catmullrom_basis0 + lVar23 + 0xd9c);
      fStack_30c = *(float *)(catmullrom_basis0 + lVar23 + 0xda0);
      fStack_308 = *(float *)(catmullrom_basis0 + lVar23 + 0xda4);
      local_620 = auVar133._0_4_;
      auVar16 = vmovshdup_avx(auVar133);
      local_540 = auVar16._0_8_;
      auVar188._0_4_ = local_320 * local_620;
      auVar188._4_4_ = fStack_31c * local_620;
      auVar188._8_4_ = fStack_318 * local_620;
      auVar188._12_4_ = fStack_314 * local_620;
      auVar188._16_4_ = fStack_310 * local_620;
      auVar188._20_4_ = fStack_30c * local_620;
      auVar188._24_4_ = fStack_308 * local_620;
      auVar188._28_4_ = 0;
      fVar206 = auVar16._0_4_;
      auVar106._0_4_ = fVar206 * local_320;
      fVar211 = auVar16._4_4_;
      auVar106._4_4_ = fVar211 * fStack_31c;
      auVar106._8_4_ = fVar206 * fStack_318;
      auVar106._12_4_ = fVar211 * fStack_314;
      auVar106._16_4_ = fVar206 * fStack_310;
      auVar106._20_4_ = fVar211 * fStack_30c;
      auVar106._24_4_ = fVar206 * fStack_308;
      auVar106._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar188,auVar128,local_6a0);
      auVar17 = vfmadd231ps_fma(auVar106,auVar128,local_560);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x484);
      uVar98 = auVar103._0_4_;
      local_640._4_4_ = uVar98;
      local_640._0_4_ = uVar98;
      local_640._8_4_ = uVar98;
      local_640._12_4_ = uVar98;
      local_640._16_4_ = uVar98;
      local_640._20_4_ = uVar98;
      local_640._24_4_ = uVar98;
      local_640._28_4_ = uVar98;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar106,local_640);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar106,local_2a0);
      auVar188 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23);
      uVar98 = auVar19._0_4_;
      local_5a0._4_4_ = uVar98;
      local_5a0._0_4_ = uVar98;
      local_5a0._8_4_ = uVar98;
      local_5a0._12_4_ = uVar98;
      local_5a0._16_4_ = uVar98;
      local_5a0._20_4_ = uVar98;
      local_5a0._24_4_ = uVar98;
      local_5a0._28_4_ = uVar98;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar188,local_5a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar188,local_400);
      auVar10 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x908);
      fVar178 = *(float *)(catmullrom_basis1 + lVar23 + 0xd8c);
      fVar179 = *(float *)(catmullrom_basis1 + lVar23 + 0xd90);
      fVar180 = *(float *)(catmullrom_basis1 + lVar23 + 0xd94);
      fVar190 = *(float *)(catmullrom_basis1 + lVar23 + 0xd98);
      fVar191 = *(float *)(catmullrom_basis1 + lVar23 + 0xd9c);
      fVar76 = *(float *)(catmullrom_basis1 + lVar23 + 0xda0);
      fVar77 = *(float *)(catmullrom_basis1 + lVar23 + 0xda4);
      fStack_61c = local_620;
      fStack_618 = local_620;
      fStack_614 = local_620;
      fStack_610 = local_620;
      fStack_60c = local_620;
      fStack_608 = local_620;
      fStack_604 = local_620;
      auVar114._4_4_ = local_620 * fVar179;
      auVar114._0_4_ = local_620 * fVar178;
      auVar114._8_4_ = local_620 * fVar180;
      auVar114._12_4_ = local_620 * fVar190;
      auVar114._16_4_ = local_620 * fVar191;
      auVar114._20_4_ = local_620 * fVar76;
      auVar114._24_4_ = local_620 * fVar77;
      auVar114._28_4_ = local_620;
      auVar18 = vfmadd231ps_fma(auVar114,auVar10,local_6a0);
      uStack_538 = local_540;
      uStack_530 = local_540;
      uStack_528 = local_540;
      auVar165._4_4_ = fVar211 * fVar179;
      auVar165._0_4_ = fVar206 * fVar178;
      auVar165._8_4_ = fVar206 * fVar180;
      auVar165._12_4_ = fVar211 * fVar190;
      auVar165._16_4_ = fVar206 * fVar191;
      auVar165._20_4_ = fVar211 * fVar76;
      auVar165._24_4_ = fVar206 * fVar77;
      auVar165._28_4_ = uVar195;
      auVar105 = vfmadd231ps_fma(auVar165,auVar10,local_560);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x484);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar114,local_640);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar114,local_2a0);
      auVar165 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar165,local_5a0);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar165,local_400);
      local_2c0 = ZEXT1632(auVar18);
      _local_300 = ZEXT1632(auVar16);
      auVar159 = vsubps_avx(local_2c0,_local_300);
      auVar163 = ZEXT3264(auVar159);
      local_2e0 = ZEXT1632(auVar105);
      auVar107 = ZEXT1632(auVar17);
      local_340 = vsubps_avx(local_2e0,auVar107);
      auVar108._0_4_ = auVar17._0_4_ * auVar159._0_4_;
      auVar108._4_4_ = auVar17._4_4_ * auVar159._4_4_;
      auVar108._8_4_ = auVar17._8_4_ * auVar159._8_4_;
      auVar108._12_4_ = auVar17._12_4_ * auVar159._12_4_;
      auVar108._16_4_ = auVar159._16_4_ * 0.0;
      auVar108._20_4_ = auVar159._20_4_ * 0.0;
      auVar108._24_4_ = auVar159._24_4_ * 0.0;
      auVar108._28_4_ = 0;
      fVar132 = local_340._0_4_;
      auVar124._0_4_ = auVar16._0_4_ * fVar132;
      fVar116 = local_340._4_4_;
      auVar124._4_4_ = auVar16._4_4_ * fVar116;
      fVar118 = local_340._8_4_;
      auVar124._8_4_ = auVar16._8_4_ * fVar118;
      fVar119 = local_340._12_4_;
      auVar124._12_4_ = auVar16._12_4_ * fVar119;
      fVar120 = local_340._16_4_;
      auVar124._16_4_ = fVar120 * 0.0;
      fVar181 = local_340._20_4_;
      auVar124._20_4_ = fVar181 * 0.0;
      fVar173 = local_340._24_4_;
      auVar124._24_4_ = fVar173 * 0.0;
      auVar124._28_4_ = 0;
      auVar108 = vsubps_avx(auVar108,auVar124);
      auVar16 = vpermilps_avx(*pauVar1,0xff);
      uVar99 = auVar16._0_8_;
      local_80._8_8_ = uVar99;
      local_80._0_8_ = uVar99;
      local_80._16_8_ = uVar99;
      local_80._24_8_ = uVar99;
      auVar17 = vpermilps_avx(*pauVar2,0xff);
      uVar99 = auVar17._0_8_;
      local_a0._8_8_ = uVar99;
      local_a0._0_8_ = uVar99;
      local_a0._16_8_ = uVar99;
      local_a0._24_8_ = uVar99;
      auVar17 = vpermilps_avx(*pauVar3,0xff);
      uVar99 = auVar17._0_8_;
      local_c0._8_8_ = uVar99;
      local_c0._0_8_ = uVar99;
      local_c0._16_8_ = uVar99;
      local_c0._24_8_ = uVar99;
      auVar87._12_4_ = fStack_484;
      auVar87._0_12_ = *pauVar4;
      auVar17 = vpermilps_avx(auVar87,0xff);
      local_e0 = auVar17._0_8_;
      iStack_304 = *(undefined4 *)(catmullrom_basis0 + lVar23 + 0xda8);
      fVar115 = auVar17._0_4_;
      fVar117 = auVar17._4_4_;
      auVar15._4_4_ = fStack_31c * fVar117;
      auVar15._0_4_ = local_320 * fVar115;
      auVar15._8_4_ = fStack_318 * fVar115;
      auVar15._12_4_ = fStack_314 * fVar117;
      auVar15._16_4_ = fStack_310 * fVar115;
      auVar15._20_4_ = fStack_30c * fVar117;
      auVar15._24_4_ = fStack_308 * fVar115;
      auVar15._28_4_ = fVar211;
      auVar17 = vfmadd231ps_fma(auVar15,local_c0,auVar128);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar106,local_a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar188,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar199._4_4_ = fVar117 * fVar179;
      auVar199._0_4_ = fVar115 * fVar178;
      auVar199._8_4_ = fVar115 * fVar180;
      auVar199._12_4_ = fVar117 * fVar190;
      auVar199._16_4_ = fVar115 * fVar191;
      auVar199._20_4_ = fVar117 * fVar76;
      auVar199._24_4_ = fVar115 * fVar77;
      auVar199._28_4_ = auVar188._28_4_;
      auVar18 = vfmadd231ps_fma(auVar199,auVar10,local_c0);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar114,local_a0);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar165,local_80);
      auVar21._4_4_ = fVar116 * fVar116;
      auVar21._0_4_ = fVar132 * fVar132;
      auVar21._8_4_ = fVar118 * fVar118;
      auVar21._12_4_ = fVar119 * fVar119;
      auVar21._16_4_ = fVar120 * fVar120;
      auVar21._20_4_ = fVar181 * fVar181;
      auVar21._24_4_ = fVar173 * fVar173;
      auVar21._28_4_ = auVar16._4_4_;
      auVar16 = vfmadd231ps_fma(auVar21,auVar159,auVar159);
      auVar15 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
      auVar22._4_4_ = auVar15._4_4_ * auVar15._4_4_ * auVar16._4_4_;
      auVar22._0_4_ = auVar15._0_4_ * auVar15._0_4_ * auVar16._0_4_;
      auVar22._8_4_ = auVar15._8_4_ * auVar15._8_4_ * auVar16._8_4_;
      auVar22._12_4_ = auVar15._12_4_ * auVar15._12_4_ * auVar16._12_4_;
      auVar22._16_4_ = auVar15._16_4_ * auVar15._16_4_ * 0.0;
      auVar22._20_4_ = auVar15._20_4_ * auVar15._20_4_ * 0.0;
      auVar22._24_4_ = auVar15._24_4_ * auVar15._24_4_ * 0.0;
      auVar22._28_4_ = auVar15._28_4_;
      auVar166._4_4_ = auVar108._4_4_ * auVar108._4_4_;
      auVar166._0_4_ = auVar108._0_4_ * auVar108._0_4_;
      auVar166._8_4_ = auVar108._8_4_ * auVar108._8_4_;
      auVar166._12_4_ = auVar108._12_4_ * auVar108._12_4_;
      auVar166._16_4_ = auVar108._16_4_ * auVar108._16_4_;
      auVar166._20_4_ = auVar108._20_4_ * auVar108._20_4_;
      auVar166._24_4_ = auVar108._24_4_ * auVar108._24_4_;
      auVar166._28_4_ = auVar108._28_4_;
      auVar15 = vcmpps_avx(auVar166,auVar22,2);
      auVar109._0_4_ = (float)iVar12;
      local_420._4_12_ = auVar133._4_12_;
      local_420._0_4_ = auVar109._0_4_;
      fVar132 = auVar20._0_4_ * 4.7683716e-07;
      local_420._16_16_ = auVar129._16_16_;
      auVar109._4_4_ = auVar109._0_4_;
      auVar109._8_4_ = auVar109._0_4_;
      auVar109._12_4_ = auVar109._0_4_;
      auVar109._16_4_ = auVar109._0_4_;
      auVar109._20_4_ = auVar109._0_4_;
      auVar109._24_4_ = auVar109._0_4_;
      auVar109._28_4_ = auVar109._0_4_;
      auVar129 = vcmpps_avx(_DAT_01faff40,auVar109,1);
      auVar16 = vpermilps_avx(auVar19,0xaa);
      uVar99 = auVar16._0_8_;
      local_460._8_8_ = uVar99;
      local_460._0_8_ = uVar99;
      local_460._16_8_ = uVar99;
      local_460._24_8_ = uVar99;
      auVar20 = vpermilps_avx(auVar103,0xaa);
      uVar99 = auVar20._0_8_;
      local_100._8_8_ = uVar99;
      local_100._0_8_ = uVar99;
      local_100._16_8_ = uVar99;
      local_100._24_8_ = uVar99;
      auVar20 = vpermilps_avx(auVar102,0xaa);
      uVar99 = auVar20._0_8_;
      local_3e0._8_8_ = uVar99;
      local_3e0._0_8_ = uVar99;
      local_3e0._16_8_ = uVar99;
      local_3e0._24_8_ = uVar99;
      auVar20 = vshufps_avx(auVar133,auVar133,0xaa);
      uVar99 = auVar20._0_8_;
      register0x00001508 = uVar99;
      local_580 = uVar99;
      register0x00001510 = uVar99;
      register0x00001518 = uVar99;
      auVar108 = auVar129 & auVar15;
      local_720._0_16_ = ZEXT416((uint)fVar132);
      if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0x7f,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0xbf,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar108[0x1f]) {
        auVar210 = ZEXT3264(auVar113);
        auVar189 = ZEXT3264(auVar184);
LAB_016162c3:
        auVar172 = ZEXT3264(CONCAT428(local_620,
                                      CONCAT424(local_620,
                                                CONCAT420(local_620,
                                                          CONCAT416(local_620,
                                                                    CONCAT412(local_620,
                                                                              CONCAT48(local_620,
                                                                                       CONCAT44(
                                                  local_620,local_620))))))));
LAB_016162de:
        auVar204 = ZEXT3264(_local_580);
        auVar200 = ZEXT3264(local_6a0);
        auVar194 = ZEXT3264(local_6c0);
        auVar177 = ZEXT3264(local_640);
        auVar169 = ZEXT3264(local_560);
        bVar96 = false;
        auVar131 = ZEXT3264(local_700);
        auVar145 = ZEXT3264(local_5a0);
      }
      else {
        local_360 = vandps_avx(auVar15,auVar129);
        fVar173 = auVar20._0_4_;
        fVar205 = auVar20._4_4_;
        auVar129._4_4_ = fVar205 * fVar179;
        auVar129._0_4_ = fVar173 * fVar178;
        auVar129._8_4_ = fVar173 * fVar180;
        auVar129._12_4_ = fVar205 * fVar190;
        auVar129._16_4_ = fVar173 * fVar191;
        auVar129._20_4_ = fVar205 * fVar76;
        auVar129._24_4_ = fVar173 * fVar77;
        auVar129._28_4_ = local_360._28_4_;
        auVar20 = vfmadd213ps_fma(auVar10,local_3e0,auVar129);
        auVar20 = vfmadd213ps_fma(auVar114,local_100,ZEXT1632(auVar20));
        auVar20 = vfmadd213ps_fma(auVar165,local_460,ZEXT1632(auVar20));
        local_380 = ZEXT1632(auVar20);
        auVar10._4_4_ = fVar205 * fStack_31c;
        auVar10._0_4_ = fVar173 * local_320;
        auVar10._8_4_ = fVar173 * fStack_318;
        auVar10._12_4_ = fVar205 * fStack_314;
        auVar10._16_4_ = fVar173 * fStack_310;
        auVar10._20_4_ = fVar205 * fStack_30c;
        auVar10._24_4_ = fVar173 * fStack_308;
        auVar10._28_4_ = local_360._28_4_;
        auVar20 = vfmadd213ps_fma(auVar128,local_3e0,auVar10);
        auVar20 = vfmadd213ps_fma(auVar106,local_100,ZEXT1632(auVar20));
        auVar129 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1210);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1694);
        auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1b18);
        fVar115 = *(float *)(catmullrom_basis0 + lVar23 + 0x1f9c);
        fVar116 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa0);
        fVar117 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa4);
        fVar118 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa8);
        fVar119 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fac);
        fVar120 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb0);
        fVar181 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fb4);
        auVar25._4_4_ = local_620 * fVar116;
        auVar25._0_4_ = local_620 * fVar115;
        auVar25._8_4_ = local_620 * fVar117;
        auVar25._12_4_ = local_620 * fVar118;
        auVar25._16_4_ = local_620 * fVar119;
        auVar25._20_4_ = local_620 * fVar120;
        auVar25._24_4_ = local_620 * fVar181;
        auVar25._28_4_ = auVar159._28_4_;
        auVar26._4_4_ = fVar211 * fVar116;
        auVar26._0_4_ = fVar206 * fVar115;
        auVar26._8_4_ = fVar206 * fVar117;
        auVar26._12_4_ = fVar211 * fVar118;
        auVar26._16_4_ = fVar206 * fVar119;
        auVar26._20_4_ = fVar211 * fVar120;
        auVar26._24_4_ = fVar206 * fVar181;
        auVar26._28_4_ = *(undefined4 *)(catmullrom_basis1 + lVar23 + 0xda8);
        auVar193._0_4_ = fVar115 * fVar173;
        auVar193._4_4_ = fVar116 * fVar205;
        auVar193._8_4_ = fVar117 * fVar173;
        auVar193._12_4_ = fVar118 * fVar205;
        auVar193._16_4_ = fVar119 * fVar173;
        auVar193._20_4_ = fVar120 * fVar205;
        auVar193._24_4_ = fVar181 * fVar173;
        auVar193._28_4_ = 0;
        auVar105 = vfmadd231ps_fma(auVar25,auVar106,local_6a0);
        auVar19 = vfmadd231ps_fma(auVar26,auVar106,local_560);
        auVar103 = vfmadd231ps_fma(auVar193,local_3e0,auVar106);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar128,local_640);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar128,local_2a0);
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_100,auVar128);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar129,local_5a0);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar129,local_400);
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_460,auVar129);
        fVar115 = *(float *)(catmullrom_basis1 + lVar23 + 0x1f9c);
        fVar116 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa0);
        fVar117 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa4);
        fVar118 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa8);
        fVar119 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fac);
        fVar120 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb0);
        fVar181 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fb4);
        auVar128._4_4_ = local_620 * fVar116;
        auVar128._0_4_ = local_620 * fVar115;
        auVar128._8_4_ = local_620 * fVar117;
        auVar128._12_4_ = local_620 * fVar118;
        auVar128._16_4_ = local_620 * fVar119;
        auVar128._20_4_ = local_620 * fVar120;
        auVar128._24_4_ = local_620 * fVar181;
        auVar128._28_4_ = local_620;
        auVar27._4_4_ = fVar211 * fVar116;
        auVar27._0_4_ = fVar206 * fVar115;
        auVar27._8_4_ = fVar206 * fVar117;
        auVar27._12_4_ = fVar211 * fVar118;
        auVar27._16_4_ = fVar206 * fVar119;
        auVar27._20_4_ = fVar211 * fVar120;
        auVar27._24_4_ = fVar206 * fVar181;
        auVar27._28_4_ = fVar211;
        auVar28._4_4_ = fVar116 * fVar205;
        auVar28._0_4_ = fVar115 * fVar173;
        auVar28._8_4_ = fVar117 * fVar173;
        auVar28._12_4_ = fVar118 * fVar205;
        auVar28._16_4_ = fVar119 * fVar173;
        auVar28._20_4_ = fVar120 * fVar205;
        auVar28._24_4_ = fVar181 * fVar173;
        auVar28._28_4_ = auVar16._4_4_;
        auVar129 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1b18);
        auVar16 = vfmadd231ps_fma(auVar128,auVar129,local_6a0);
        auVar102 = vfmadd231ps_fma(auVar27,auVar129,local_560);
        auVar133 = vfmadd231ps_fma(auVar28,auVar129,local_3e0);
        auVar129 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1694);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,local_640);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar129,local_2a0);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),local_100,auVar129);
        auVar129 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1210);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,local_5a0);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar129,local_400);
        auVar125._8_4_ = 0x7fffffff;
        auVar125._0_8_ = 0x7fffffff7fffffff;
        auVar125._12_4_ = 0x7fffffff;
        auVar125._16_4_ = 0x7fffffff;
        auVar125._20_4_ = 0x7fffffff;
        auVar125._24_4_ = 0x7fffffff;
        auVar125._28_4_ = 0x7fffffff;
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),local_460,auVar129);
        auVar129 = vandps_avx(ZEXT1632(auVar105),auVar125);
        auVar128 = vandps_avx(ZEXT1632(auVar19),auVar125);
        auVar128 = vmaxps_avx(auVar129,auVar128);
        auVar129 = vandps_avx(ZEXT1632(auVar103),auVar125);
        auVar129 = vmaxps_avx(auVar128,auVar129);
        auVar138._4_4_ = fVar132;
        auVar138._0_4_ = fVar132;
        auVar138._8_4_ = fVar132;
        auVar138._12_4_ = fVar132;
        auVar138._16_4_ = fVar132;
        auVar138._20_4_ = fVar132;
        auVar138._24_4_ = fVar132;
        auVar138._28_4_ = fVar132;
        auVar129 = vcmpps_avx(auVar129,auVar138,1);
        auVar106 = vblendvps_avx(ZEXT1632(auVar105),auVar159,auVar129);
        auVar10 = vblendvps_avx(ZEXT1632(auVar19),local_340,auVar129);
        auVar129 = vandps_avx(ZEXT1632(auVar16),auVar125);
        auVar128 = vandps_avx(ZEXT1632(auVar102),auVar125);
        auVar114 = vmaxps_avx(auVar129,auVar128);
        auVar129 = vandps_avx(ZEXT1632(auVar133),auVar125);
        auVar129 = vmaxps_avx(auVar114,auVar129);
        auVar165 = vcmpps_avx(auVar129,auVar138,1);
        auVar129 = vblendvps_avx(ZEXT1632(auVar16),auVar159,auVar165);
        auVar114 = vblendvps_avx(ZEXT1632(auVar102),local_340,auVar165);
        auVar20 = vfmadd213ps_fma(auVar188,local_460,ZEXT1632(auVar20));
        auVar16 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar10,auVar10);
        auVar15 = vrsqrtps_avx(ZEXT1632(auVar16));
        fVar132 = auVar15._0_4_;
        fVar115 = auVar15._4_4_;
        fVar116 = auVar15._8_4_;
        fVar117 = auVar15._12_4_;
        fVar118 = auVar15._16_4_;
        fVar119 = auVar15._20_4_;
        fVar120 = auVar15._24_4_;
        auVar159._4_4_ = fVar115 * fVar115 * fVar115 * auVar16._4_4_ * -0.5;
        auVar159._0_4_ = fVar132 * fVar132 * fVar132 * auVar16._0_4_ * -0.5;
        auVar159._8_4_ = fVar116 * fVar116 * fVar116 * auVar16._8_4_ * -0.5;
        auVar159._12_4_ = fVar117 * fVar117 * fVar117 * auVar16._12_4_ * -0.5;
        auVar159._16_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar159._20_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar159._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar159._28_4_ = 0;
        auVar152._8_4_ = 0x3fc00000;
        auVar152._0_8_ = 0x3fc000003fc00000;
        auVar152._12_4_ = 0x3fc00000;
        auVar152._16_4_ = 0x3fc00000;
        auVar152._20_4_ = 0x3fc00000;
        auVar152._24_4_ = 0x3fc00000;
        auVar152._28_4_ = 0x3fc00000;
        auVar16 = vfmadd231ps_fma(auVar159,auVar152,auVar15);
        fVar132 = auVar16._0_4_;
        fVar115 = auVar16._4_4_;
        auVar29._4_4_ = auVar10._4_4_ * fVar115;
        auVar29._0_4_ = auVar10._0_4_ * fVar132;
        fVar116 = auVar16._8_4_;
        auVar29._8_4_ = auVar10._8_4_ * fVar116;
        fVar117 = auVar16._12_4_;
        auVar29._12_4_ = auVar10._12_4_ * fVar117;
        auVar29._16_4_ = auVar10._16_4_ * 0.0;
        auVar29._20_4_ = auVar10._20_4_ * 0.0;
        auVar29._24_4_ = auVar10._24_4_ * 0.0;
        auVar29._28_4_ = auVar15._28_4_;
        auVar30._4_4_ = -auVar106._4_4_ * fVar115;
        auVar30._0_4_ = -auVar106._0_4_ * fVar132;
        auVar30._8_4_ = -auVar106._8_4_ * fVar116;
        auVar30._12_4_ = -auVar106._12_4_ * fVar117;
        auVar30._16_4_ = -auVar106._16_4_ * 0.0;
        auVar30._20_4_ = -auVar106._20_4_ * 0.0;
        auVar30._24_4_ = -auVar106._24_4_ * 0.0;
        auVar30._28_4_ = auVar128._28_4_;
        auVar16 = vfmadd213ps_fma(auVar129,auVar129,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar114,auVar114);
        auVar128 = vrsqrtps_avx(ZEXT1632(auVar16));
        auVar31._28_4_ = auVar165._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar117 * 0.0,
                                CONCAT48(fVar116 * 0.0,CONCAT44(fVar115 * 0.0,fVar132 * 0.0))));
        fVar132 = auVar128._0_4_;
        fVar115 = auVar128._4_4_;
        fVar116 = auVar128._8_4_;
        fVar117 = auVar128._12_4_;
        fVar118 = auVar128._16_4_;
        fVar119 = auVar128._20_4_;
        fVar120 = auVar128._24_4_;
        auVar32._4_4_ = fVar115 * fVar115 * fVar115 * auVar16._4_4_ * -0.5;
        auVar32._0_4_ = fVar132 * fVar132 * fVar132 * auVar16._0_4_ * -0.5;
        auVar32._8_4_ = fVar116 * fVar116 * fVar116 * auVar16._8_4_ * -0.5;
        auVar32._12_4_ = fVar117 * fVar117 * fVar117 * auVar16._12_4_ * -0.5;
        auVar32._16_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar32._20_4_ = fVar119 * fVar119 * fVar119 * -0.0;
        auVar32._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar32._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar32,auVar152,auVar128);
        fVar132 = auVar16._0_4_;
        fVar115 = auVar16._4_4_;
        auVar33._4_4_ = auVar114._4_4_ * fVar115;
        auVar33._0_4_ = auVar114._0_4_ * fVar132;
        fVar116 = auVar16._8_4_;
        auVar33._8_4_ = auVar114._8_4_ * fVar116;
        fVar117 = auVar16._12_4_;
        auVar33._12_4_ = auVar114._12_4_ * fVar117;
        auVar33._16_4_ = auVar114._16_4_ * 0.0;
        auVar33._20_4_ = auVar114._20_4_ * 0.0;
        auVar33._24_4_ = auVar114._24_4_ * 0.0;
        auVar33._28_4_ = 0;
        auVar34._4_4_ = -auVar129._4_4_ * fVar115;
        auVar34._0_4_ = -auVar129._0_4_ * fVar132;
        auVar34._8_4_ = -auVar129._8_4_ * fVar116;
        auVar34._12_4_ = -auVar129._12_4_ * fVar117;
        auVar34._16_4_ = -auVar129._16_4_ * 0.0;
        auVar34._20_4_ = -auVar129._20_4_ * 0.0;
        auVar34._24_4_ = -auVar129._24_4_ * 0.0;
        auVar34._28_4_ = auVar114._28_4_;
        auVar35._28_4_ = auVar128._28_4_;
        auVar35._0_28_ =
             ZEXT1628(CONCAT412(fVar117 * 0.0,
                                CONCAT48(fVar116 * 0.0,CONCAT44(fVar115 * 0.0,fVar132 * 0.0))));
        auVar16 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar17),_local_300);
        auVar129 = ZEXT1632(auVar17);
        auVar105 = vfmadd213ps_fma(auVar30,auVar129,auVar107);
        auVar19 = vfmadd213ps_fma(auVar31,auVar129,ZEXT1632(auVar20));
        auVar122 = vfnmadd213ps_fma(auVar29,auVar129,_local_300);
        auVar103 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar18),local_2c0);
        auVar101 = vfnmadd213ps_fma(auVar30,auVar129,auVar107);
        auVar129 = ZEXT1632(auVar18);
        auVar102 = vfmadd213ps_fma(auVar34,auVar129,local_2e0);
        auVar124 = ZEXT1632(auVar17);
        auVar147 = vfnmadd231ps_fma(ZEXT1632(auVar20),auVar124,auVar31);
        auVar133 = vfmadd213ps_fma(auVar35,auVar129,local_380);
        auVar123 = vfnmadd213ps_fma(auVar33,auVar129,local_2c0);
        auVar141 = vfnmadd213ps_fma(auVar34,auVar129,local_2e0);
        local_440 = ZEXT1632(auVar18);
        auVar100 = vfnmadd231ps_fma(local_380,local_440,auVar35);
        auVar129 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar101));
        auVar128 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar147));
        auVar107._4_4_ = auVar147._4_4_ * auVar129._4_4_;
        auVar107._0_4_ = auVar147._0_4_ * auVar129._0_4_;
        auVar107._8_4_ = auVar147._8_4_ * auVar129._8_4_;
        auVar107._12_4_ = auVar147._12_4_ * auVar129._12_4_;
        auVar107._16_4_ = auVar129._16_4_ * 0.0;
        auVar107._20_4_ = auVar129._20_4_ * 0.0;
        auVar107._24_4_ = auVar129._24_4_ * 0.0;
        auVar107._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar101),auVar128);
        auVar36._4_4_ = auVar122._4_4_ * auVar128._4_4_;
        auVar36._0_4_ = auVar122._0_4_ * auVar128._0_4_;
        auVar36._8_4_ = auVar122._8_4_ * auVar128._8_4_;
        auVar36._12_4_ = auVar122._12_4_ * auVar128._12_4_;
        auVar36._16_4_ = auVar128._16_4_ * 0.0;
        auVar36._20_4_ = auVar128._20_4_ * 0.0;
        auVar36._24_4_ = auVar128._24_4_ * 0.0;
        auVar36._28_4_ = auVar128._28_4_;
        auVar114 = ZEXT1632(auVar122);
        auVar128 = vsubps_avx(ZEXT1632(auVar103),auVar114);
        auVar20 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar147),auVar128);
        auVar37._4_4_ = auVar101._4_4_ * auVar128._4_4_;
        auVar37._0_4_ = auVar101._0_4_ * auVar128._0_4_;
        auVar37._8_4_ = auVar101._8_4_ * auVar128._8_4_;
        auVar37._12_4_ = auVar101._12_4_ * auVar128._12_4_;
        auVar37._16_4_ = auVar128._16_4_ * 0.0;
        auVar37._20_4_ = auVar128._20_4_ * 0.0;
        auVar37._24_4_ = auVar128._24_4_ * 0.0;
        auVar37._28_4_ = auVar128._28_4_;
        auVar122 = vfmsub231ps_fma(auVar37,auVar114,auVar129);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar122),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        local_4e0._16_16_ = auVar188._16_16_;
        local_4e0._0_16_ = local_360._16_16_;
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar159 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
        local_740 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar16),auVar159);
        auVar129 = vblendvps_avx(ZEXT1632(auVar141),ZEXT1632(auVar105),auVar159);
        auVar128 = vblendvps_avx(ZEXT1632(auVar100),ZEXT1632(auVar19),auVar159);
        auVar106 = vblendvps_avx(auVar114,ZEXT1632(auVar103),auVar159);
        auVar188 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar102),auVar159);
        auVar10 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar133),auVar159);
        auVar114 = vblendvps_avx(ZEXT1632(auVar103),auVar114,auVar159);
        auVar165 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar101),auVar159);
        auVar20 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar15 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar147),auVar159);
        auVar108 = vsubps_avx(auVar114,local_740);
        auVar165 = vsubps_avx(auVar165,auVar129);
        auVar199 = vsubps_avx(auVar15,auVar128);
        auVar21 = vsubps_avx(local_740,auVar106);
        auVar22 = vsubps_avx(auVar129,auVar188);
        auVar166 = vsubps_avx(auVar128,auVar10);
        auVar38._4_4_ = auVar199._4_4_ * local_740._4_4_;
        auVar38._0_4_ = auVar199._0_4_ * local_740._0_4_;
        auVar38._8_4_ = auVar199._8_4_ * local_740._8_4_;
        auVar38._12_4_ = auVar199._12_4_ * local_740._12_4_;
        auVar38._16_4_ = auVar199._16_4_ * local_740._16_4_;
        auVar38._20_4_ = auVar199._20_4_ * local_740._20_4_;
        auVar38._24_4_ = auVar199._24_4_ * local_740._24_4_;
        auVar38._28_4_ = auVar15._28_4_;
        auVar16 = vfmsub231ps_fma(auVar38,auVar128,auVar108);
        auVar39._4_4_ = auVar108._4_4_ * auVar129._4_4_;
        auVar39._0_4_ = auVar108._0_4_ * auVar129._0_4_;
        auVar39._8_4_ = auVar108._8_4_ * auVar129._8_4_;
        auVar39._12_4_ = auVar108._12_4_ * auVar129._12_4_;
        auVar39._16_4_ = auVar108._16_4_ * auVar129._16_4_;
        auVar39._20_4_ = auVar108._20_4_ * auVar129._20_4_;
        auVar39._24_4_ = auVar108._24_4_ * auVar129._24_4_;
        auVar39._28_4_ = auVar114._28_4_;
        auVar18 = vfmsub231ps_fma(auVar39,local_740,auVar165);
        auVar163 = ZEXT3264(auVar129);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar110._0_4_ = auVar165._0_4_ * auVar128._0_4_;
        auVar110._4_4_ = auVar165._4_4_ * auVar128._4_4_;
        auVar110._8_4_ = auVar165._8_4_ * auVar128._8_4_;
        auVar110._12_4_ = auVar165._12_4_ * auVar128._12_4_;
        auVar110._16_4_ = auVar165._16_4_ * auVar128._16_4_;
        auVar110._20_4_ = auVar165._20_4_ * auVar128._20_4_;
        auVar110._24_4_ = auVar165._24_4_ * auVar128._24_4_;
        auVar110._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar110,auVar129,auVar199);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar111._0_4_ = auVar166._0_4_ * auVar106._0_4_;
        auVar111._4_4_ = auVar166._4_4_ * auVar106._4_4_;
        auVar111._8_4_ = auVar166._8_4_ * auVar106._8_4_;
        auVar111._12_4_ = auVar166._12_4_ * auVar106._12_4_;
        auVar111._16_4_ = auVar166._16_4_ * auVar106._16_4_;
        auVar111._20_4_ = auVar166._20_4_ * auVar106._20_4_;
        auVar111._24_4_ = auVar166._24_4_ * auVar106._24_4_;
        auVar111._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar111,auVar21,auVar10);
        auVar40._4_4_ = auVar22._4_4_ * auVar10._4_4_;
        auVar40._0_4_ = auVar22._0_4_ * auVar10._0_4_;
        auVar40._8_4_ = auVar22._8_4_ * auVar10._8_4_;
        auVar40._12_4_ = auVar22._12_4_ * auVar10._12_4_;
        auVar40._16_4_ = auVar22._16_4_ * auVar10._16_4_;
        auVar40._20_4_ = auVar22._20_4_ * auVar10._20_4_;
        auVar40._24_4_ = auVar22._24_4_ * auVar10._24_4_;
        auVar40._28_4_ = auVar10._28_4_;
        auVar105 = vfmsub231ps_fma(auVar40,auVar188,auVar166);
        auVar41._4_4_ = auVar21._4_4_ * auVar188._4_4_;
        auVar41._0_4_ = auVar21._0_4_ * auVar188._0_4_;
        auVar41._8_4_ = auVar21._8_4_ * auVar188._8_4_;
        auVar41._12_4_ = auVar21._12_4_ * auVar188._12_4_;
        auVar41._16_4_ = auVar21._16_4_ * auVar188._16_4_;
        auVar41._20_4_ = auVar21._20_4_ * auVar188._20_4_;
        auVar41._24_4_ = auVar21._24_4_ * auVar188._24_4_;
        auVar41._28_4_ = auVar188._28_4_;
        auVar19 = vfmsub231ps_fma(auVar41,auVar22,auVar106);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
        auVar106 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar105));
        auVar106 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,2);
        auVar16 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
        auVar20 = vpand_avx(auVar20,auVar16);
        auVar106 = vpmovsxwd_avx2(auVar20);
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
LAB_01617548:
          auVar169 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar210 = ZEXT3264(auVar113);
          auVar189 = ZEXT3264(auVar184);
        }
        else {
          auVar42._4_4_ = auVar165._4_4_ * auVar166._4_4_;
          auVar42._0_4_ = auVar165._0_4_ * auVar166._0_4_;
          auVar42._8_4_ = auVar165._8_4_ * auVar166._8_4_;
          auVar42._12_4_ = auVar165._12_4_ * auVar166._12_4_;
          auVar42._16_4_ = auVar165._16_4_ * auVar166._16_4_;
          auVar42._20_4_ = auVar165._20_4_ * auVar166._20_4_;
          auVar42._24_4_ = auVar165._24_4_ * auVar166._24_4_;
          auVar42._28_4_ = auVar106._28_4_;
          auVar102 = vfmsub231ps_fma(auVar42,auVar22,auVar199);
          auVar126._0_4_ = auVar21._0_4_ * auVar199._0_4_;
          auVar126._4_4_ = auVar21._4_4_ * auVar199._4_4_;
          auVar126._8_4_ = auVar21._8_4_ * auVar199._8_4_;
          auVar126._12_4_ = auVar21._12_4_ * auVar199._12_4_;
          auVar126._16_4_ = auVar21._16_4_ * auVar199._16_4_;
          auVar126._20_4_ = auVar21._20_4_ * auVar199._20_4_;
          auVar126._24_4_ = auVar21._24_4_ * auVar199._24_4_;
          auVar126._28_4_ = 0;
          auVar103 = vfmsub231ps_fma(auVar126,auVar108,auVar166);
          auVar43._4_4_ = auVar108._4_4_ * auVar22._4_4_;
          auVar43._0_4_ = auVar108._0_4_ * auVar22._0_4_;
          auVar43._8_4_ = auVar108._8_4_ * auVar22._8_4_;
          auVar43._12_4_ = auVar108._12_4_ * auVar22._12_4_;
          auVar43._16_4_ = auVar108._16_4_ * auVar22._16_4_;
          auVar43._20_4_ = auVar108._20_4_ * auVar22._20_4_;
          auVar43._24_4_ = auVar108._24_4_ * auVar22._24_4_;
          auVar43._28_4_ = auVar108._28_4_;
          auVar133 = vfmsub231ps_fma(auVar43,auVar21,auVar165);
          auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar133));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar102),_DAT_01faff00);
          auVar106 = vrcpps_avx(ZEXT1632(auVar19));
          auVar198._8_4_ = 0x3f800000;
          auVar198._0_8_ = 0x3f8000003f800000;
          auVar198._12_4_ = 0x3f800000;
          auVar198._16_4_ = 0x3f800000;
          auVar198._20_4_ = 0x3f800000;
          auVar198._24_4_ = 0x3f800000;
          auVar198._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar106,ZEXT1632(auVar19),auVar198);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar106,auVar106);
          auVar44._4_4_ = auVar133._4_4_ * auVar128._4_4_;
          auVar44._0_4_ = auVar133._0_4_ * auVar128._0_4_;
          auVar44._8_4_ = auVar133._8_4_ * auVar128._8_4_;
          auVar44._12_4_ = auVar133._12_4_ * auVar128._12_4_;
          auVar44._16_4_ = auVar128._16_4_ * 0.0;
          auVar44._20_4_ = auVar128._20_4_ * 0.0;
          auVar44._24_4_ = auVar128._24_4_ * 0.0;
          auVar44._28_4_ = auVar128._28_4_;
          auVar103 = vfmadd231ps_fma(auVar44,auVar129,ZEXT1632(auVar103));
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT1632(auVar102),local_740);
          fVar115 = auVar16._0_4_;
          fVar116 = auVar16._4_4_;
          fVar117 = auVar16._8_4_;
          fVar118 = auVar16._12_4_;
          auVar45._28_4_ = auVar129._28_4_;
          auVar45._0_28_ =
               ZEXT1628(CONCAT412(fVar118 * auVar103._12_4_,
                                  CONCAT48(fVar117 * auVar103._8_4_,
                                           CONCAT44(fVar116 * auVar103._4_4_,
                                                    fVar115 * auVar103._0_4_))));
          auVar163 = ZEXT3264(auVar45);
          auVar16 = vpermilps_avx((undefined1  [16])aVar7,0xff);
          auVar112._0_8_ = auVar16._0_8_;
          auVar112._8_8_ = auVar112._0_8_;
          auVar112._16_8_ = auVar112._0_8_;
          auVar112._24_8_ = auVar112._0_8_;
          fVar132 = ray->tfar;
          auVar127._4_4_ = fVar132;
          auVar127._0_4_ = fVar132;
          auVar127._8_4_ = fVar132;
          auVar127._12_4_ = fVar132;
          auVar127._16_4_ = fVar132;
          auVar127._20_4_ = fVar132;
          auVar127._24_4_ = fVar132;
          auVar127._28_4_ = fVar132;
          auVar129 = vcmpps_avx(auVar112,auVar45,2);
          auVar128 = vcmpps_avx(auVar45,auVar127,2);
          auVar129 = vandps_avx(auVar128,auVar129);
          auVar16 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
          auVar20 = vpand_avx(auVar20,auVar16);
          auVar129 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar129 >> 0x7f,0) == '\0') &&
                (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0xbf,0) == '\0') &&
              (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar129[0x1f]) goto LAB_01617548;
          auVar129 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,4);
          auVar16 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
          auVar20 = vpand_avx(auVar20,auVar16);
          auVar129 = vpmovsxwd_avx2(auVar20);
          auVar169 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar210 = ZEXT3264(auVar113);
          auVar189 = ZEXT3264(auVar184);
          if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar129 >> 0x7f,0) != '\0') ||
                (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar129 >> 0xbf,0) != '\0') ||
              (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar129[0x1f] < '\0') {
            auVar113 = ZEXT1632(CONCAT412(fVar118 * auVar18._12_4_,
                                          CONCAT48(fVar117 * auVar18._8_4_,
                                                   CONCAT44(fVar116 * auVar18._4_4_,
                                                            fVar115 * auVar18._0_4_))));
            auVar128 = ZEXT1632(CONCAT412(fVar118 * auVar105._12_4_,
                                          CONCAT48(fVar117 * auVar105._8_4_,
                                                   CONCAT44(fVar116 * auVar105._4_4_,
                                                            fVar115 * auVar105._0_4_))));
            auVar153._8_4_ = 0x3f800000;
            auVar153._0_8_ = 0x3f8000003f800000;
            auVar153._12_4_ = 0x3f800000;
            auVar153._16_4_ = 0x3f800000;
            auVar153._20_4_ = 0x3f800000;
            auVar153._24_4_ = 0x3f800000;
            auVar153._28_4_ = 0x3f800000;
            auVar184 = vsubps_avx(auVar153,auVar113);
            auVar184 = vblendvps_avx(auVar184,auVar113,auVar159);
            auVar210 = ZEXT3264(auVar184);
            auVar184 = vsubps_avx(auVar153,auVar128);
            local_3a0 = vblendvps_avx(auVar184,auVar128,auVar159);
            auVar169 = ZEXT3264(auVar129);
            auVar189 = ZEXT3264(auVar45);
          }
        }
        auVar204 = ZEXT3264(_local_580);
        auVar200 = ZEXT3264(local_6a0);
        auVar194 = ZEXT3264(local_6c0);
        auVar129 = auVar169._0_32_;
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0x7f,0) == '\0') &&
              (auVar169 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar129 >> 0xbf,0) == '\0') &&
            (auVar169 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar169[0x1f]) goto LAB_016162c3;
        auVar184 = vsubps_avx(local_440,auVar124);
        local_260 = auVar210._0_32_;
        auVar20 = vfmadd213ps_fma(auVar184,local_260,auVar124);
        fVar132 = local_668->depth_scale;
        auVar184._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar132;
        auVar184._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar132;
        auVar184._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar132;
        auVar184._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar132;
        auVar184._16_4_ = fVar132 * 0.0;
        auVar184._20_4_ = fVar132 * 0.0;
        auVar184._24_4_ = fVar132 * 0.0;
        auVar184._28_4_ = 0;
        local_220 = auVar189._0_32_;
        auVar184 = vcmpps_avx(local_220,auVar184,6);
        auVar113 = auVar129 & auVar184;
        auVar169 = ZEXT3264(local_560);
        auVar172 = ZEXT3264(CONCAT428(local_620,
                                      CONCAT424(local_620,
                                                CONCAT420(local_620,
                                                          CONCAT416(local_620,
                                                                    CONCAT412(local_620,
                                                                              CONCAT48(local_620,
                                                                                       CONCAT44(
                                                  local_620,local_620))))))));
        auVar177 = ZEXT3264(local_640);
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          auVar113._8_4_ = 0xbf800000;
          auVar113._0_8_ = 0xbf800000bf800000;
          auVar113._12_4_ = 0xbf800000;
          auVar113._16_4_ = 0xbf800000;
          auVar113._20_4_ = 0xbf800000;
          auVar113._24_4_ = 0xbf800000;
          auVar113._28_4_ = 0xbf800000;
          auVar139._8_4_ = 0x40000000;
          auVar139._0_8_ = 0x4000000040000000;
          auVar139._12_4_ = 0x40000000;
          auVar139._16_4_ = 0x40000000;
          auVar139._20_4_ = 0x40000000;
          auVar139._24_4_ = 0x40000000;
          auVar139._28_4_ = 0x40000000;
          auVar20 = vfmadd213ps_fma(local_3a0,auVar139,auVar113);
          local_3a0 = ZEXT1632(auVar20);
          auVar113 = local_3a0;
          local_240 = ZEXT1632(auVar20);
          local_200 = 0;
          local_1fc = iVar12;
          local_1f0 = *(undefined8 *)*pauVar1;
          uStack_1e8 = *(undefined8 *)(*pauVar1 + 8);
          local_1e0 = *(undefined8 *)*pauVar2;
          uStack_1d8 = *(undefined8 *)(*pauVar2 + 8);
          local_1d0 = *(undefined8 *)*pauVar3;
          uStack_1c8 = *(undefined8 *)(*pauVar3 + 8);
          if ((pGVar93->mask & ray->mask) != 0) {
            auVar131 = ZEXT3264(local_700);
            auVar145 = ZEXT3264(local_5a0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar96 = true, pGVar93->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar129 = vandps_avx(auVar184,auVar129);
              fVar132 = 1.0 / auVar109._0_4_;
              local_180[0] = fVar132 * (auVar210._0_4_ + 0.0);
              local_180[1] = fVar132 * (auVar210._4_4_ + 1.0);
              local_180[2] = fVar132 * (auVar210._8_4_ + 2.0);
              local_180[3] = fVar132 * (auVar210._12_4_ + 3.0);
              fStack_170 = fVar132 * (auVar210._16_4_ + 4.0);
              fStack_16c = fVar132 * (auVar210._20_4_ + 5.0);
              fStack_168 = fVar132 * (auVar210._24_4_ + 6.0);
              fStack_164 = auVar210._28_4_ + 7.0;
              local_3a0._0_8_ = auVar20._0_8_;
              local_3a0._8_8_ = auVar20._8_8_;
              local_160 = local_3a0._0_8_;
              uStack_158 = local_3a0._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = local_220;
              uVar91 = vmovmskps_avx(auVar129);
              local_3a0 = auVar113;
              if (uVar91 == 0) goto LAB_01616391;
              uVar92 = (ulong)(uVar91 & 0xff);
              local_760 = ZEXT1632(CONCAT88(auVar17._8_8_,uVar92));
              lVar94 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
                lVar94 = lVar94 + 1;
              }
              local_4e0._0_4_ = ray->tfar;
              local_4c0 = local_260;
              local_6e0 = local_220;
              do {
                local_514 = local_180[lVar94];
                local_510 = *(undefined4 *)((long)&local_160 + lVar94 * 4);
                local_740._0_8_ = lVar94;
                ray->tfar = *(float *)(local_140 + lVar94 * 4);
                fVar132 = 1.0 - local_514;
                auVar105 = ZEXT416((uint)local_514);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,
                                          ZEXT416(0xc0a00000));
                auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_514 * local_514 * 3.0)),
                                          ZEXT416((uint)(local_514 + local_514)),auVar20);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,
                                          ZEXT416(0x40000000));
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132 * -3.0)),
                                          ZEXT416((uint)(fVar132 + fVar132)),auVar20);
                auVar163 = ZEXT1664(auVar17);
                auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(local_514 * (fVar132 + fVar132))),
                                           ZEXT416((uint)fVar132),ZEXT416((uint)fVar132));
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_514 * local_514)),auVar105,
                                          ZEXT416((uint)(fVar132 * -2.0)));
                fVar132 = auVar17._0_4_ * 0.5;
                fVar115 = auVar20._0_4_ * 0.5;
                auVar148._0_4_ = fVar115 * local_490;
                auVar148._4_4_ = fVar115 * fStack_48c;
                auVar148._8_4_ = fVar115 * fStack_488;
                auVar148._12_4_ = fVar115 * fStack_484;
                auVar134._4_4_ = fVar132;
                auVar134._0_4_ = fVar132;
                auVar134._8_4_ = fVar132;
                auVar134._12_4_ = fVar132;
                auVar80._8_8_ = uStack_5f8;
                auVar80._0_8_ = local_600;
                auVar20 = vfmadd132ps_fma(auVar134,auVar148,auVar80);
                fVar132 = auVar16._0_4_ * 0.5;
                auVar149._4_4_ = fVar132;
                auVar149._0_4_ = fVar132;
                auVar149._8_4_ = fVar132;
                auVar149._12_4_ = fVar132;
                auVar82._8_8_ = uStack_5e8;
                auVar82._0_8_ = local_5f0;
                auVar20 = vfmadd132ps_fma(auVar149,auVar20,auVar82);
                fVar132 = auVar18._0_4_ * 0.5;
                auVar135._4_4_ = fVar132;
                auVar135._0_4_ = fVar132;
                auVar135._8_4_ = fVar132;
                auVar135._12_4_ = fVar132;
                auVar84._8_8_ = uStack_5d8;
                auVar84._0_8_ = local_5e0;
                auVar20 = vfmadd132ps_fma(auVar135,auVar20,auVar84);
                local_5d0.context = context->user;
                local_520 = vmovlps_avx(auVar20);
                local_518 = vextractps_avx(auVar20,2);
                local_50c = (int)local_4e8;
                local_508 = (int)local_670;
                local_504 = (local_5d0.context)->instID[0];
                local_500 = (local_5d0.context)->instPrimID[0];
                local_76c = -1;
                local_5d0.valid = &local_76c;
                local_5d0.geometryUserPtr = pGVar93->userPtr;
                local_5d0.ray = (RTCRayN *)ray;
                local_5d0.hit = (RTCHitN *)&local_520;
                local_5d0.N = 1;
                if (pGVar93->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016166a9:
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar93->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar163 = ZEXT1664(auVar163._0_16_);
                    (*p_Var13)(&local_5d0);
                    if (*local_5d0.valid == 0) goto LAB_016166ed;
                  }
                  bVar96 = true;
                  auVar210 = ZEXT3264(local_4c0);
                  auVar131 = ZEXT3264(local_700);
                  auVar189 = ZEXT3264(local_6e0);
                  auVar194 = ZEXT3264(local_6c0);
                  auVar200 = ZEXT3264(local_6a0);
                  auVar169 = ZEXT3264(local_560);
                  auVar172 = ZEXT3264(CONCAT428(fStack_604,
                                                CONCAT424(fStack_608,
                                                          CONCAT420(fStack_60c,
                                                                    CONCAT416(fStack_610,
                                                                              CONCAT412(fStack_614,
                                                                                        CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                  auVar177 = ZEXT3264(local_640);
                  auVar145 = ZEXT3264(local_5a0);
                  auVar204 = ZEXT3264(_local_580);
                  break;
                }
                auVar163 = ZEXT1664(auVar17);
                (*pGVar93->occlusionFilterN)(&local_5d0);
                if (*local_5d0.valid != 0) goto LAB_016166a9;
LAB_016166ed:
                ray->tfar = (float)local_4e0._0_4_;
                uVar95 = local_760._0_8_ ^ 1L << (local_740._0_8_ & 0x3f);
                bVar96 = false;
                local_760._0_8_ = uVar95;
                lVar94 = 0;
                for (uVar92 = uVar95; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000)
                {
                  lVar94 = lVar94 + 1;
                }
                auVar210 = ZEXT3264(local_4c0);
                auVar131 = ZEXT3264(local_700);
                auVar189 = ZEXT3264(local_6e0);
                auVar194 = ZEXT3264(local_6c0);
                auVar200 = ZEXT3264(local_6a0);
                auVar169 = ZEXT3264(local_560);
                auVar172 = ZEXT3264(CONCAT428(fStack_604,
                                              CONCAT424(fStack_608,
                                                        CONCAT420(fStack_60c,
                                                                  CONCAT416(fStack_610,
                                                                            CONCAT412(fStack_614,
                                                                                      CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                auVar177 = ZEXT3264(local_640);
                auVar145 = ZEXT3264(local_5a0);
                auVar204 = ZEXT3264(_local_580);
              } while (uVar95 != 0);
            }
            goto LAB_016162e7;
          }
          goto LAB_016162de;
        }
LAB_01616391:
        auVar145 = ZEXT3264(local_5a0);
        bVar96 = false;
        auVar131 = ZEXT3264(local_700);
      }
LAB_016162e7:
      local_700 = auVar131._0_32_;
      if (8 < iVar12) {
        _local_580 = auVar204._0_32_;
        local_320 = (float)iVar12;
        fStack_31c = (float)iVar12;
        fStack_318 = (float)iVar12;
        fStack_314 = (float)iVar12;
        fStack_310 = (float)iVar12;
        fStack_30c = (float)iVar12;
        fStack_308 = (float)iVar12;
        iStack_304 = iVar12;
        local_360._4_4_ = local_720._0_4_;
        local_360._0_4_ = local_720._0_4_;
        local_360._8_4_ = local_720._0_4_;
        local_360._12_4_ = local_720._0_4_;
        local_360._16_4_ = local_720._0_4_;
        local_360._20_4_ = local_720._0_4_;
        local_360._24_4_ = local_720._0_4_;
        local_360._28_4_ = local_720._0_4_;
        auVar20 = vpermilps_avx(local_660._0_16_,0xff);
        local_380._8_8_ = auVar20._0_8_;
        local_380._0_8_ = local_380._8_8_;
        local_380._16_8_ = local_380._8_8_;
        local_380._24_8_ = local_380._8_8_;
        local_120 = 1.0 / (float)local_420._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        lVar94 = 8;
        local_4c0 = auVar210._0_32_;
        local_6e0 = auVar189._0_32_;
        fVar132 = (float)local_540;
        fVar115 = local_540._4_4_;
        fVar116 = (float)uStack_538;
        fVar117 = uStack_538._4_4_;
        fVar118 = (float)uStack_530;
        fVar119 = uStack_530._4_4_;
        fVar120 = (float)uStack_528;
        do {
          auVar108 = auVar194._0_32_;
          local_700 = auVar131._0_32_;
          auVar129 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar94 * 4 + lVar23);
          auVar184 = *(undefined1 (*) [32])(lVar23 + 0x21b37f0 + lVar94 * 4);
          local_660 = *(undefined1 (*) [32])(lVar23 + 0x21b3c74 + lVar94 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar23 + 0x21b40f8 + lVar94 * 4);
          fVar181 = *(float *)*pauVar5;
          fVar173 = *(float *)(*pauVar5 + 4);
          fVar178 = *(float *)(*pauVar5 + 8);
          fVar179 = *(float *)(*pauVar5 + 0xc);
          fVar180 = *(float *)(*pauVar5 + 0x10);
          fVar190 = *(float *)(*pauVar5 + 0x14);
          fVar191 = *(float *)(*pauVar5 + 0x18);
          auVar89 = *(undefined1 (*) [28])*pauVar5;
          auVar131._0_4_ = fVar181 * auVar172._0_4_;
          auVar131._4_4_ = fVar173 * auVar172._4_4_;
          auVar131._8_4_ = fVar178 * auVar172._8_4_;
          auVar131._12_4_ = fVar179 * auVar172._12_4_;
          auVar131._16_4_ = fVar180 * auVar172._16_4_;
          auVar131._20_4_ = fVar190 * auVar172._20_4_;
          auVar131._28_36_ = auVar204._28_36_;
          auVar131._24_4_ = fVar191 * auVar172._24_4_;
          auVar189._0_4_ = fVar181 * fVar132;
          auVar189._4_4_ = fVar173 * fVar115;
          auVar189._8_4_ = fVar178 * fVar116;
          auVar189._12_4_ = fVar179 * fVar117;
          auVar189._16_4_ = fVar180 * fVar118;
          auVar189._20_4_ = fVar190 * fVar119;
          auVar189._28_36_ = auVar163._28_36_;
          auVar189._24_4_ = fVar191 * fVar120;
          auVar20 = vfmadd231ps_fma(auVar131._0_32_,local_660,auVar200._0_32_);
          auVar165 = auVar169._0_32_;
          auVar16 = vfmadd231ps_fma(auVar189._0_32_,local_660,auVar165);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar184,auVar177._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar184,local_2a0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar129,auVar145._0_32_);
          auVar204 = ZEXT1664(auVar20);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,local_400);
          local_720 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar94 * 4 + lVar23);
          auVar113 = *(undefined1 (*) [32])(lVar23 + 0x21b5c10 + lVar94 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar23 + 0x21b6094 + lVar94 * 4);
          pfVar6 = (float *)(lVar23 + 0x21b6518 + lVar94 * 4);
          fVar76 = *pfVar6;
          fVar77 = pfVar6[1];
          fVar206 = pfVar6[2];
          fVar211 = pfVar6[3];
          fVar205 = pfVar6[4];
          fVar78 = pfVar6[5];
          fVar79 = pfVar6[6];
          auVar210._0_4_ = fVar76 * auVar172._0_4_;
          auVar210._4_4_ = fVar77 * auVar172._4_4_;
          auVar210._8_4_ = fVar206 * auVar172._8_4_;
          auVar210._12_4_ = fVar211 * auVar172._12_4_;
          auVar210._16_4_ = fVar205 * auVar172._16_4_;
          auVar210._20_4_ = fVar78 * auVar172._20_4_;
          auVar210._28_36_ = auVar172._28_36_;
          auVar210._24_4_ = fVar79 * auVar172._24_4_;
          auVar163._0_4_ = fVar132 * fVar76;
          auVar163._4_4_ = fVar115 * fVar77;
          auVar163._8_4_ = fVar116 * fVar206;
          auVar163._12_4_ = fVar117 * fVar211;
          auVar163._16_4_ = fVar118 * fVar205;
          auVar163._20_4_ = fVar119 * fVar78;
          auVar163._28_36_ = auVar200._28_36_;
          auVar163._24_4_ = fVar120 * fVar79;
          auVar17 = vfmadd231ps_fma(auVar210._0_32_,auVar128,auVar200._0_32_);
          auVar18 = vfmadd231ps_fma(auVar163._0_32_,auVar128,auVar165);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar113,auVar177._0_32_);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar113,local_2a0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_720,auVar145._0_32_);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_720,local_400);
          local_2c0 = ZEXT1632(auVar17);
          local_2e0 = ZEXT1632(auVar20);
          auVar188 = vsubps_avx(local_2c0,local_2e0);
          auVar159 = ZEXT1632(auVar16);
          auVar199 = ZEXT1632(auVar18);
          local_440 = vsubps_avx(auVar199,auVar159);
          auVar75._4_4_ = auVar188._4_4_ * auVar16._4_4_;
          auVar75._0_4_ = auVar188._0_4_ * auVar16._0_4_;
          auVar75._8_4_ = auVar188._8_4_ * auVar16._8_4_;
          auVar75._12_4_ = auVar188._12_4_ * auVar16._12_4_;
          auVar75._16_4_ = auVar188._16_4_ * 0.0;
          auVar75._20_4_ = auVar188._20_4_ * 0.0;
          auVar75._24_4_ = auVar188._24_4_ * 0.0;
          auVar75._28_4_ = local_400._28_4_;
          auVar163 = ZEXT3264(local_660);
          fVar132 = local_440._0_4_;
          fVar115 = local_440._4_4_;
          auVar46._4_4_ = auVar20._4_4_ * fVar115;
          auVar46._0_4_ = auVar20._0_4_ * fVar132;
          fVar116 = local_440._8_4_;
          auVar46._8_4_ = auVar20._8_4_ * fVar116;
          fVar117 = local_440._12_4_;
          auVar46._12_4_ = auVar20._12_4_ * fVar117;
          fVar118 = local_440._16_4_;
          auVar46._16_4_ = fVar118 * 0.0;
          fVar119 = local_440._20_4_;
          auVar46._20_4_ = fVar119 * 0.0;
          fVar120 = local_440._24_4_;
          auVar46._24_4_ = fVar120 * 0.0;
          auVar46._28_4_ = local_2a0._28_4_;
          auVar10 = vsubps_avx(auVar75,auVar46);
          _local_300 = *pauVar5;
          auVar15 = _local_300;
          auVar194._0_4_ = fVar181 * (float)local_e0;
          auVar194._4_4_ = fVar173 * local_e0._4_4_;
          auVar194._8_4_ = fVar178 * (float)uStack_d8;
          auVar194._12_4_ = fVar179 * uStack_d8._4_4_;
          auVar194._16_4_ = fVar180 * (float)uStack_d0;
          auVar194._20_4_ = fVar190 * uStack_d0._4_4_;
          auVar194._28_36_ = auVar169._28_36_;
          auVar194._24_4_ = fVar191 * (float)uStack_c8;
          auVar20 = vfmadd231ps_fma(auVar194._0_32_,local_660,local_c0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar184);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_80,auVar129);
          auVar47._4_4_ = fVar77 * local_e0._4_4_;
          auVar47._0_4_ = fVar76 * (float)local_e0;
          auVar47._8_4_ = fVar206 * (float)uStack_d8;
          auVar47._12_4_ = fVar211 * uStack_d8._4_4_;
          auVar47._16_4_ = fVar205 * (float)uStack_d0;
          auVar47._20_4_ = fVar78 * uStack_d0._4_4_;
          auVar47._24_4_ = fVar79 * (float)uStack_c8;
          auVar47._28_4_ = uStack_c8._4_4_;
          auVar17 = vfmadd231ps_fma(auVar47,auVar128,local_c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar113,local_a0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_720,local_80);
          auVar48._4_4_ = fVar115 * fVar115;
          auVar48._0_4_ = fVar132 * fVar132;
          auVar48._8_4_ = fVar116 * fVar116;
          auVar48._12_4_ = fVar117 * fVar117;
          auVar48._16_4_ = fVar118 * fVar118;
          auVar48._20_4_ = fVar119 * fVar119;
          auVar48._24_4_ = fVar120 * fVar120;
          auVar48._28_4_ = local_80._28_4_;
          auVar18 = vfmadd231ps_fma(auVar48,auVar188,auVar188);
          auVar106 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar17));
          auVar185._0_4_ = auVar106._0_4_ * auVar106._0_4_ * auVar18._0_4_;
          auVar185._4_4_ = auVar106._4_4_ * auVar106._4_4_ * auVar18._4_4_;
          auVar185._8_4_ = auVar106._8_4_ * auVar106._8_4_ * auVar18._8_4_;
          auVar185._12_4_ = auVar106._12_4_ * auVar106._12_4_ * auVar18._12_4_;
          auVar185._16_4_ = auVar106._16_4_ * auVar106._16_4_ * 0.0;
          auVar185._20_4_ = auVar106._20_4_ * auVar106._20_4_ * 0.0;
          auVar185._24_4_ = auVar106._24_4_ * auVar106._24_4_ * 0.0;
          auVar185._28_4_ = 0;
          auVar49._4_4_ = auVar10._4_4_ * auVar10._4_4_;
          auVar49._0_4_ = auVar10._0_4_ * auVar10._0_4_;
          auVar49._8_4_ = auVar10._8_4_ * auVar10._8_4_;
          auVar49._12_4_ = auVar10._12_4_ * auVar10._12_4_;
          auVar49._16_4_ = auVar10._16_4_ * auVar10._16_4_;
          auVar49._20_4_ = auVar10._20_4_ * auVar10._20_4_;
          auVar49._24_4_ = auVar10._24_4_ * auVar10._24_4_;
          auVar49._28_4_ = auVar10._28_4_;
          auVar106 = vcmpps_avx(auVar49,auVar185,2);
          local_200 = (int)lVar94;
          auVar186._4_4_ = local_200;
          auVar186._0_4_ = local_200;
          auVar186._8_4_ = local_200;
          auVar186._12_4_ = local_200;
          auVar186._16_4_ = local_200;
          auVar186._20_4_ = local_200;
          auVar186._24_4_ = local_200;
          auVar186._28_4_ = local_200;
          auVar10 = vpor_avx2(auVar186,_DAT_01fe9900);
          auVar88._4_4_ = fStack_31c;
          auVar88._0_4_ = local_320;
          auVar88._8_4_ = fStack_318;
          auVar88._12_4_ = fStack_314;
          auVar88._16_4_ = fStack_310;
          auVar88._20_4_ = fStack_30c;
          auVar88._24_4_ = fStack_308;
          auVar88._28_4_ = iStack_304;
          auVar114 = vpcmpgtd_avx2(auVar88,auVar10);
          auVar10 = auVar114 & auVar106;
          fVar132 = (float)local_540;
          fVar115 = local_540._4_4_;
          fVar116 = (float)uStack_538;
          fVar117 = uStack_538._4_4_;
          fVar118 = (float)uStack_530;
          fVar119 = uStack_530._4_4_;
          fVar120 = (float)uStack_528;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0x7f,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0xbf,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar10[0x1f]) {
            auVar194 = ZEXT3264(auVar108);
LAB_01616fd8:
            auVar200 = ZEXT3264(local_6a0);
            auVar189 = ZEXT3264(local_6e0);
            auVar169 = ZEXT3264(auVar165);
            auVar131 = ZEXT3264(local_700);
            auVar172 = ZEXT3264(CONCAT428(fStack_604,
                                          CONCAT424(fStack_608,
                                                    CONCAT420(fStack_60c,
                                                              CONCAT416(fStack_610,
                                                                        CONCAT412(fStack_614,
                                                                                  CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
            auVar177 = ZEXT3264(local_640);
          }
          else {
            local_340 = vandps_avx(auVar114,auVar106);
            auVar50._4_4_ = fVar77 * (float)local_580._4_4_;
            auVar50._0_4_ = fVar76 * (float)local_580._0_4_;
            auVar50._8_4_ = fVar206 * fStack_578;
            auVar50._12_4_ = fVar211 * fStack_574;
            auVar50._16_4_ = fVar205 * fStack_570;
            auVar50._20_4_ = fVar78 * fStack_56c;
            auVar50._24_4_ = fVar79 * fStack_568;
            auVar50._28_4_ = auVar106._28_4_;
            auVar18 = vfmadd213ps_fma(auVar128,local_3e0,auVar50);
            local_420 = auVar199;
            auVar18 = vfmadd213ps_fma(auVar113,local_100,ZEXT1632(auVar18));
            auVar18 = vfmadd132ps_fma(local_720,ZEXT1632(auVar18),local_460);
            local_300._0_4_ = auVar89._0_4_;
            local_300._4_4_ = auVar89._4_4_;
            fStack_2f8 = auVar89._8_4_;
            fStack_2f4 = auVar89._12_4_;
            fStack_2f0 = auVar89._16_4_;
            fStack_2ec = auVar89._20_4_;
            fStack_2e8 = auVar89._24_4_;
            auVar51._4_4_ = (float)local_580._4_4_ * (float)local_300._4_4_;
            auVar51._0_4_ = (float)local_580._0_4_ * (float)local_300._0_4_;
            auVar51._8_4_ = fStack_578 * fStack_2f8;
            auVar51._12_4_ = fStack_574 * fStack_2f4;
            auVar51._16_4_ = fStack_570 * fStack_2f0;
            auVar51._20_4_ = fStack_56c * fStack_2ec;
            auVar51._24_4_ = fStack_568 * fStack_2e8;
            auVar51._28_4_ = auVar106._28_4_;
            auVar105 = vfmadd213ps_fma(local_660,local_3e0,auVar51);
            auVar105 = vfmadd213ps_fma(auVar184,local_100,ZEXT1632(auVar105));
            auVar184 = *(undefined1 (*) [32])(lVar23 + 0x21b457c + lVar94 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar23 + 0x21b4a00 + lVar94 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar23 + 0x21b4e84 + lVar94 * 4);
            pfVar6 = (float *)(lVar23 + 0x21b5308 + lVar94 * 4);
            fVar181 = *pfVar6;
            fVar173 = pfVar6[1];
            fVar178 = pfVar6[2];
            fVar179 = pfVar6[3];
            fVar180 = pfVar6[4];
            fVar190 = pfVar6[5];
            fVar191 = pfVar6[6];
            auVar52._4_4_ = fStack_61c * fVar173;
            auVar52._0_4_ = local_620 * fVar181;
            auVar52._8_4_ = fStack_618 * fVar178;
            auVar52._12_4_ = fStack_614 * fVar179;
            auVar52._16_4_ = fStack_610 * fVar180;
            auVar52._20_4_ = fStack_60c * fVar190;
            auVar52._24_4_ = fStack_608 * fVar191;
            auVar52._28_4_ = auVar188._28_4_;
            auVar202._0_4_ = (float)local_540 * fVar181;
            auVar202._4_4_ = local_540._4_4_ * fVar173;
            auVar202._8_4_ = (float)uStack_538 * fVar178;
            auVar202._12_4_ = uStack_538._4_4_ * fVar179;
            auVar202._16_4_ = (float)uStack_530 * fVar180;
            auVar202._20_4_ = uStack_530._4_4_ * fVar190;
            auVar202._24_4_ = (float)uStack_528 * fVar191;
            auVar202._28_4_ = 0;
            auVar53._4_4_ = fVar173 * (float)local_580._4_4_;
            auVar53._0_4_ = fVar181 * (float)local_580._0_4_;
            auVar53._8_4_ = fVar178 * fStack_578;
            auVar53._12_4_ = fVar179 * fStack_574;
            auVar53._16_4_ = fVar180 * fStack_570;
            auVar53._20_4_ = fVar190 * fStack_56c;
            auVar53._24_4_ = fVar191 * fStack_568;
            auVar53._28_4_ = pfVar6[7];
            auVar19 = vfmadd231ps_fma(auVar52,auVar128,local_6a0);
            auVar103 = vfmadd231ps_fma(auVar202,auVar128,auVar165);
            auVar102 = vfmadd231ps_fma(auVar53,local_3e0,auVar128);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar113,local_640);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar113,local_2a0);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_100,auVar113);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar184,local_5a0);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar184,local_400);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar184,local_460);
            pfVar6 = (float *)(lVar23 + 0x21b7728 + lVar94 * 4);
            fVar181 = *pfVar6;
            fVar173 = pfVar6[1];
            fVar178 = pfVar6[2];
            fVar179 = pfVar6[3];
            fVar180 = pfVar6[4];
            fVar190 = pfVar6[5];
            fVar191 = pfVar6[6];
            auVar54._4_4_ = fStack_61c * fVar173;
            auVar54._0_4_ = local_620 * fVar181;
            auVar54._8_4_ = fStack_618 * fVar178;
            auVar54._12_4_ = fStack_614 * fVar179;
            auVar54._16_4_ = fStack_610 * fVar180;
            auVar54._20_4_ = fStack_60c * fVar190;
            auVar54._24_4_ = fStack_608 * fVar191;
            auVar54._28_4_ = fStack_604;
            auVar55._4_4_ = local_540._4_4_ * fVar173;
            auVar55._0_4_ = (float)local_540 * fVar181;
            auVar55._8_4_ = (float)uStack_538 * fVar178;
            auVar55._12_4_ = uStack_538._4_4_ * fVar179;
            auVar55._16_4_ = (float)uStack_530 * fVar180;
            auVar55._20_4_ = uStack_530._4_4_ * fVar190;
            auVar55._24_4_ = (float)uStack_528 * fVar191;
            auVar55._28_4_ = uStack_528._4_4_;
            auVar56._4_4_ = fVar173 * (float)local_580._4_4_;
            auVar56._0_4_ = fVar181 * (float)local_580._0_4_;
            auVar56._8_4_ = fVar178 * fStack_578;
            auVar56._12_4_ = fVar179 * fStack_574;
            auVar56._16_4_ = fVar180 * fStack_570;
            auVar56._20_4_ = fVar190 * fStack_56c;
            auVar56._24_4_ = fVar191 * fStack_568;
            auVar56._28_4_ = pfVar6[7];
            auVar184 = *(undefined1 (*) [32])(lVar23 + 0x21b72a4 + lVar94 * 4);
            auVar133 = vfmadd231ps_fma(auVar54,auVar184,local_6a0);
            auVar122 = vfmadd231ps_fma(auVar55,auVar184,auVar165);
            auVar101 = vfmadd231ps_fma(auVar56,local_3e0,auVar184);
            auVar184 = *(undefined1 (*) [32])(lVar23 + 0x21b6e20 + lVar94 * 4);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar184,local_640);
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar184,local_2a0);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),local_100,auVar184);
            auVar184 = *(undefined1 (*) [32])(lVar23 + 0x21b699c + lVar94 * 4);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar184,local_5a0);
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar184,local_400);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),local_460,auVar184);
            auVar187._8_4_ = 0x7fffffff;
            auVar187._0_8_ = 0x7fffffff7fffffff;
            auVar187._12_4_ = 0x7fffffff;
            auVar187._16_4_ = 0x7fffffff;
            auVar187._20_4_ = 0x7fffffff;
            auVar187._24_4_ = 0x7fffffff;
            auVar187._28_4_ = 0x7fffffff;
            auVar184 = vandps_avx(ZEXT1632(auVar19),auVar187);
            auVar113 = vandps_avx(ZEXT1632(auVar103),auVar187);
            auVar113 = vmaxps_avx(auVar184,auVar113);
            auVar184 = vandps_avx(ZEXT1632(auVar102),auVar187);
            auVar184 = vmaxps_avx(auVar113,auVar184);
            auVar184 = vcmpps_avx(auVar184,local_360,1);
            auVar128 = vblendvps_avx(ZEXT1632(auVar19),auVar188,auVar184);
            auVar106 = vblendvps_avx(ZEXT1632(auVar103),local_440,auVar184);
            auVar184 = vandps_avx(ZEXT1632(auVar133),auVar187);
            auVar113 = vandps_avx(ZEXT1632(auVar122),auVar187);
            auVar113 = vmaxps_avx(auVar184,auVar113);
            auVar184 = vandps_avx(auVar187,ZEXT1632(auVar101));
            auVar184 = vmaxps_avx(auVar113,auVar184);
            auVar113 = vcmpps_avx(auVar184,local_360,1);
            auVar184 = vblendvps_avx(ZEXT1632(auVar133),auVar188,auVar113);
            auVar113 = vblendvps_avx(ZEXT1632(auVar122),local_440,auVar113);
            auVar105 = vfmadd213ps_fma(auVar129,local_460,ZEXT1632(auVar105));
            auVar19 = vfmadd213ps_fma(auVar128,auVar128,ZEXT832(0) << 0x20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar106,auVar106);
            auVar129 = vrsqrtps_avx(ZEXT1632(auVar19));
            fVar181 = auVar129._0_4_;
            fVar173 = auVar129._4_4_;
            fVar178 = auVar129._8_4_;
            fVar179 = auVar129._12_4_;
            fVar180 = auVar129._16_4_;
            fVar190 = auVar129._20_4_;
            fVar191 = auVar129._24_4_;
            auVar57._4_4_ = fVar173 * fVar173 * fVar173 * auVar19._4_4_ * -0.5;
            auVar57._0_4_ = fVar181 * fVar181 * fVar181 * auVar19._0_4_ * -0.5;
            auVar57._8_4_ = fVar178 * fVar178 * fVar178 * auVar19._8_4_ * -0.5;
            auVar57._12_4_ = fVar179 * fVar179 * fVar179 * auVar19._12_4_ * -0.5;
            auVar57._16_4_ = fVar180 * fVar180 * fVar180 * -0.0;
            auVar57._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
            auVar57._24_4_ = fVar191 * fVar191 * fVar191 * -0.0;
            auVar57._28_4_ = 0;
            auVar209._8_4_ = 0x3fc00000;
            auVar209._0_8_ = 0x3fc000003fc00000;
            auVar209._12_4_ = 0x3fc00000;
            auVar209._16_4_ = 0x3fc00000;
            auVar209._20_4_ = 0x3fc00000;
            auVar209._24_4_ = 0x3fc00000;
            auVar209._28_4_ = 0x3fc00000;
            auVar19 = vfmadd231ps_fma(auVar57,auVar209,auVar129);
            fVar181 = auVar19._0_4_;
            fVar173 = auVar19._4_4_;
            auVar58._4_4_ = auVar106._4_4_ * fVar173;
            auVar58._0_4_ = auVar106._0_4_ * fVar181;
            fVar178 = auVar19._8_4_;
            auVar58._8_4_ = auVar106._8_4_ * fVar178;
            fVar179 = auVar19._12_4_;
            auVar58._12_4_ = auVar106._12_4_ * fVar179;
            auVar58._16_4_ = auVar106._16_4_ * 0.0;
            auVar58._20_4_ = auVar106._20_4_ * 0.0;
            auVar58._24_4_ = auVar106._24_4_ * 0.0;
            auVar58._28_4_ = auVar129._28_4_;
            auVar59._4_4_ = fVar173 * -auVar128._4_4_;
            auVar59._0_4_ = fVar181 * -auVar128._0_4_;
            auVar59._8_4_ = fVar178 * -auVar128._8_4_;
            auVar59._12_4_ = fVar179 * -auVar128._12_4_;
            auVar59._16_4_ = -auVar128._16_4_ * 0.0;
            auVar59._20_4_ = -auVar128._20_4_ * 0.0;
            auVar59._24_4_ = -auVar128._24_4_ * 0.0;
            auVar59._28_4_ = auVar106._28_4_;
            auVar19 = vfmadd213ps_fma(auVar184,auVar184,ZEXT832(0) << 0x20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar113,auVar113);
            auVar129 = vrsqrtps_avx(ZEXT1632(auVar19));
            auVar60._28_4_ = auVar188._28_4_;
            auVar60._0_28_ =
                 ZEXT1628(CONCAT412(fVar179 * 0.0,
                                    CONCAT48(fVar178 * 0.0,CONCAT44(fVar173 * 0.0,fVar181 * 0.0))));
            fVar181 = auVar129._0_4_;
            fVar173 = auVar129._4_4_;
            fVar178 = auVar129._8_4_;
            fVar179 = auVar129._12_4_;
            fVar180 = auVar129._16_4_;
            fVar190 = auVar129._20_4_;
            fVar191 = auVar129._24_4_;
            auVar61._4_4_ = fVar173 * fVar173 * fVar173 * auVar19._4_4_ * -0.5;
            auVar61._0_4_ = fVar181 * fVar181 * fVar181 * auVar19._0_4_ * -0.5;
            auVar61._8_4_ = fVar178 * fVar178 * fVar178 * auVar19._8_4_ * -0.5;
            auVar61._12_4_ = fVar179 * fVar179 * fVar179 * auVar19._12_4_ * -0.5;
            auVar61._16_4_ = fVar180 * fVar180 * fVar180 * -0.0;
            auVar61._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
            auVar61._24_4_ = fVar191 * fVar191 * fVar191 * -0.0;
            auVar61._28_4_ = 0;
            auVar19 = vfmadd231ps_fma(auVar61,auVar209,auVar129);
            fVar181 = auVar19._0_4_;
            fVar173 = auVar19._4_4_;
            auVar62._4_4_ = auVar113._4_4_ * fVar173;
            auVar62._0_4_ = auVar113._0_4_ * fVar181;
            fVar178 = auVar19._8_4_;
            auVar62._8_4_ = auVar113._8_4_ * fVar178;
            fVar179 = auVar19._12_4_;
            auVar62._12_4_ = auVar113._12_4_ * fVar179;
            auVar62._16_4_ = auVar113._16_4_ * 0.0;
            auVar62._20_4_ = auVar113._20_4_ * 0.0;
            auVar62._24_4_ = auVar113._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar63._4_4_ = fVar173 * -auVar184._4_4_;
            auVar63._0_4_ = fVar181 * -auVar184._0_4_;
            auVar63._8_4_ = fVar178 * -auVar184._8_4_;
            auVar63._12_4_ = fVar179 * -auVar184._12_4_;
            auVar63._16_4_ = -auVar184._16_4_ * 0.0;
            auVar63._20_4_ = -auVar184._20_4_ * 0.0;
            auVar63._24_4_ = -auVar184._24_4_ * 0.0;
            auVar63._28_4_ = auVar129._28_4_;
            auVar64._28_4_ = 0xbf000000;
            auVar64._0_28_ =
                 ZEXT1628(CONCAT412(fVar179 * 0.0,
                                    CONCAT48(fVar178 * 0.0,CONCAT44(fVar173 * 0.0,fVar181 * 0.0))));
            auVar19 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar20),local_2e0);
            auVar129 = ZEXT1632(auVar20);
            auVar103 = vfmadd213ps_fma(auVar59,auVar129,auVar159);
            auVar102 = vfmadd213ps_fma(auVar60,auVar129,ZEXT1632(auVar105));
            auVar123 = vfnmadd213ps_fma(auVar58,auVar129,local_2e0);
            auVar133 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar17),local_2c0);
            auVar141 = vfnmadd213ps_fma(auVar59,auVar129,auVar159);
            auVar129 = ZEXT1632(auVar17);
            auVar122 = vfmadd213ps_fma(auVar63,auVar129,auVar199);
            auVar166 = ZEXT1632(auVar20);
            auVar121 = vfnmadd231ps_fma(ZEXT1632(auVar105),auVar166,auVar60);
            auVar105 = vfmadd213ps_fma(auVar64,auVar129,ZEXT1632(auVar18));
            auVar147 = vfnmadd213ps_fma(auVar62,auVar129,local_2c0);
            auVar100 = vfnmadd213ps_fma(auVar63,auVar129,auVar199);
            auVar146 = vfnmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar17),auVar64);
            auVar129 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar141));
            auVar184 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar121));
            auVar167._0_4_ = auVar129._0_4_ * auVar121._0_4_;
            auVar167._4_4_ = auVar129._4_4_ * auVar121._4_4_;
            auVar167._8_4_ = auVar129._8_4_ * auVar121._8_4_;
            auVar167._12_4_ = auVar129._12_4_ * auVar121._12_4_;
            auVar167._16_4_ = auVar129._16_4_ * 0.0;
            auVar167._20_4_ = auVar129._20_4_ * 0.0;
            auVar167._24_4_ = auVar129._24_4_ * 0.0;
            auVar167._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar167,ZEXT1632(auVar141),auVar184);
            auVar65._4_4_ = auVar123._4_4_ * auVar184._4_4_;
            auVar65._0_4_ = auVar123._0_4_ * auVar184._0_4_;
            auVar65._8_4_ = auVar123._8_4_ * auVar184._8_4_;
            auVar65._12_4_ = auVar123._12_4_ * auVar184._12_4_;
            auVar65._16_4_ = auVar184._16_4_ * 0.0;
            auVar65._20_4_ = auVar184._20_4_ * 0.0;
            auVar65._24_4_ = auVar184._24_4_ * 0.0;
            auVar65._28_4_ = auVar184._28_4_;
            auVar188 = ZEXT1632(auVar123);
            auVar184 = vsubps_avx(ZEXT1632(auVar133),auVar188);
            auVar114 = ZEXT1632(auVar121);
            auVar18 = vfmsub231ps_fma(auVar65,auVar114,auVar184);
            auVar66._4_4_ = auVar141._4_4_ * auVar184._4_4_;
            auVar66._0_4_ = auVar141._0_4_ * auVar184._0_4_;
            auVar66._8_4_ = auVar141._8_4_ * auVar184._8_4_;
            auVar66._12_4_ = auVar141._12_4_ * auVar184._12_4_;
            auVar66._16_4_ = auVar184._16_4_ * 0.0;
            auVar66._20_4_ = auVar184._20_4_ * 0.0;
            auVar66._24_4_ = auVar184._24_4_ * 0.0;
            auVar66._28_4_ = auVar184._28_4_;
            auVar123 = vfmsub231ps_fma(auVar66,auVar188,auVar129);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar101));
            auVar165 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,2);
            auVar129 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar19),auVar165);
            local_660 = vblendvps_avx(ZEXT1632(auVar100),ZEXT1632(auVar103),auVar165);
            auVar184 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar102),auVar165);
            auVar113 = vblendvps_avx(auVar188,ZEXT1632(auVar133),auVar165);
            auVar128 = vblendvps_avx(ZEXT1632(auVar141),ZEXT1632(auVar122),auVar165);
            auVar106 = vblendvps_avx(auVar114,ZEXT1632(auVar105),auVar165);
            auVar188 = vblendvps_avx(ZEXT1632(auVar133),auVar188,auVar165);
            auVar10 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar141),auVar165);
            auVar18 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
            local_720 = ZEXT1632(auVar18);
            auVar114 = vblendvps_avx(ZEXT1632(auVar105),auVar114,auVar165);
            auVar188 = vsubps_avx(auVar188,auVar129);
            auVar10 = vsubps_avx(auVar10,local_660);
            auVar159 = vsubps_avx(auVar114,auVar184);
            auVar199 = vsubps_avx(auVar129,auVar113);
            auVar21 = vsubps_avx(local_660,auVar128);
            auVar22 = vsubps_avx(auVar184,auVar106);
            auVar160._0_4_ = auVar159._0_4_ * auVar129._0_4_;
            auVar160._4_4_ = auVar159._4_4_ * auVar129._4_4_;
            auVar160._8_4_ = auVar159._8_4_ * auVar129._8_4_;
            auVar160._12_4_ = auVar159._12_4_ * auVar129._12_4_;
            auVar160._16_4_ = auVar159._16_4_ * auVar129._16_4_;
            auVar160._20_4_ = auVar159._20_4_ * auVar129._20_4_;
            auVar160._24_4_ = auVar159._24_4_ * auVar129._24_4_;
            auVar160._28_4_ = 0;
            auVar105 = vfmsub231ps_fma(auVar160,auVar184,auVar188);
            auVar67._4_4_ = auVar188._4_4_ * local_660._4_4_;
            auVar67._0_4_ = auVar188._0_4_ * local_660._0_4_;
            auVar67._8_4_ = auVar188._8_4_ * local_660._8_4_;
            auVar67._12_4_ = auVar188._12_4_ * local_660._12_4_;
            auVar67._16_4_ = auVar188._16_4_ * local_660._16_4_;
            auVar67._20_4_ = auVar188._20_4_ * local_660._20_4_;
            auVar67._24_4_ = auVar188._24_4_ * local_660._24_4_;
            auVar67._28_4_ = auVar114._28_4_;
            auVar19 = vfmsub231ps_fma(auVar67,auVar129,auVar10);
            auVar204 = ZEXT864(0) << 0x20;
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
            auVar161._0_4_ = auVar10._0_4_ * auVar184._0_4_;
            auVar161._4_4_ = auVar10._4_4_ * auVar184._4_4_;
            auVar161._8_4_ = auVar10._8_4_ * auVar184._8_4_;
            auVar161._12_4_ = auVar10._12_4_ * auVar184._12_4_;
            auVar161._16_4_ = auVar10._16_4_ * auVar184._16_4_;
            auVar161._20_4_ = auVar10._20_4_ * auVar184._20_4_;
            auVar161._24_4_ = auVar10._24_4_ * auVar184._24_4_;
            auVar161._28_4_ = 0;
            auVar19 = vfmsub231ps_fma(auVar161,local_660,auVar159);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
            auVar162._0_4_ = auVar22._0_4_ * auVar113._0_4_;
            auVar162._4_4_ = auVar22._4_4_ * auVar113._4_4_;
            auVar162._8_4_ = auVar22._8_4_ * auVar113._8_4_;
            auVar162._12_4_ = auVar22._12_4_ * auVar113._12_4_;
            auVar162._16_4_ = auVar22._16_4_ * auVar113._16_4_;
            auVar162._20_4_ = auVar22._20_4_ * auVar113._20_4_;
            auVar162._24_4_ = auVar22._24_4_ * auVar113._24_4_;
            auVar162._28_4_ = 0;
            auVar105 = vfmsub231ps_fma(auVar162,auVar199,auVar106);
            auVar68._4_4_ = auVar21._4_4_ * auVar106._4_4_;
            auVar68._0_4_ = auVar21._0_4_ * auVar106._0_4_;
            auVar68._8_4_ = auVar21._8_4_ * auVar106._8_4_;
            auVar68._12_4_ = auVar21._12_4_ * auVar106._12_4_;
            auVar68._16_4_ = auVar21._16_4_ * auVar106._16_4_;
            auVar68._20_4_ = auVar21._20_4_ * auVar106._20_4_;
            auVar68._24_4_ = auVar21._24_4_ * auVar106._24_4_;
            auVar68._28_4_ = auVar106._28_4_;
            auVar103 = vfmsub231ps_fma(auVar68,auVar128,auVar22);
            auVar69._4_4_ = auVar199._4_4_ * auVar128._4_4_;
            auVar69._0_4_ = auVar199._0_4_ * auVar128._0_4_;
            auVar69._8_4_ = auVar199._8_4_ * auVar128._8_4_;
            auVar69._12_4_ = auVar199._12_4_ * auVar128._12_4_;
            auVar69._16_4_ = auVar199._16_4_ * auVar128._16_4_;
            auVar69._20_4_ = auVar199._20_4_ * auVar128._20_4_;
            auVar69._24_4_ = auVar199._24_4_ * auVar128._24_4_;
            auVar69._28_4_ = auVar128._28_4_;
            auVar102 = vfmsub231ps_fma(auVar69,auVar21,auVar113);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar103));
            auVar113 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar103));
            auVar113 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,2);
            auVar105 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
            auVar105 = vpand_avx(auVar105,auVar18);
            auVar113 = vpmovsxwd_avx2(auVar105);
            auVar163 = ZEXT3264(auVar113);
            if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar113 >> 0x7f,0) == '\0') &&
                  (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0xbf,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar113[0x1f]) {
LAB_016174a9:
              auVar144._8_8_ = uStack_478;
              auVar144._0_8_ = local_480;
              auVar144._16_8_ = uStack_470;
              auVar144._24_8_ = uStack_468;
              auVar194 = ZEXT3264(auVar108);
            }
            else {
              auVar70._4_4_ = auVar10._4_4_ * auVar22._4_4_;
              auVar70._0_4_ = auVar10._0_4_ * auVar22._0_4_;
              auVar70._8_4_ = auVar10._8_4_ * auVar22._8_4_;
              auVar70._12_4_ = auVar10._12_4_ * auVar22._12_4_;
              auVar70._16_4_ = auVar10._16_4_ * auVar22._16_4_;
              auVar70._20_4_ = auVar10._20_4_ * auVar22._20_4_;
              auVar70._24_4_ = auVar10._24_4_ * auVar22._24_4_;
              auVar70._28_4_ = auVar113._28_4_;
              auVar101 = vfmsub231ps_fma(auVar70,auVar21,auVar159);
              auVar168._0_4_ = auVar199._0_4_ * auVar159._0_4_;
              auVar168._4_4_ = auVar199._4_4_ * auVar159._4_4_;
              auVar168._8_4_ = auVar199._8_4_ * auVar159._8_4_;
              auVar168._12_4_ = auVar199._12_4_ * auVar159._12_4_;
              auVar168._16_4_ = auVar199._16_4_ * auVar159._16_4_;
              auVar168._20_4_ = auVar199._20_4_ * auVar159._20_4_;
              auVar168._24_4_ = auVar199._24_4_ * auVar159._24_4_;
              auVar168._28_4_ = 0;
              auVar122 = vfmsub231ps_fma(auVar168,auVar188,auVar22);
              auVar71._4_4_ = auVar188._4_4_ * auVar21._4_4_;
              auVar71._0_4_ = auVar188._0_4_ * auVar21._0_4_;
              auVar71._8_4_ = auVar188._8_4_ * auVar21._8_4_;
              auVar71._12_4_ = auVar188._12_4_ * auVar21._12_4_;
              auVar71._16_4_ = auVar188._16_4_ * auVar21._16_4_;
              auVar71._20_4_ = auVar188._20_4_ * auVar21._20_4_;
              auVar71._24_4_ = auVar188._24_4_ * auVar21._24_4_;
              auVar71._28_4_ = auVar21._28_4_;
              auVar123 = vfmsub231ps_fma(auVar71,auVar199,auVar10);
              auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar122),ZEXT1632(auVar123));
              auVar133 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar101),ZEXT832(0) << 0x20);
              auVar113 = vrcpps_avx(ZEXT1632(auVar133));
              auVar203._8_4_ = 0x3f800000;
              auVar203._0_8_ = 0x3f8000003f800000;
              auVar203._12_4_ = 0x3f800000;
              auVar203._16_4_ = 0x3f800000;
              auVar203._20_4_ = 0x3f800000;
              auVar203._24_4_ = 0x3f800000;
              auVar203._28_4_ = 0x3f800000;
              auVar204 = ZEXT3264(auVar203);
              auVar102 = vfnmadd213ps_fma(auVar113,ZEXT1632(auVar133),auVar203);
              auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar113,auVar113);
              auVar72._4_4_ = auVar123._4_4_ * auVar184._4_4_;
              auVar72._0_4_ = auVar123._0_4_ * auVar184._0_4_;
              auVar72._8_4_ = auVar123._8_4_ * auVar184._8_4_;
              auVar72._12_4_ = auVar123._12_4_ * auVar184._12_4_;
              auVar72._16_4_ = auVar184._16_4_ * 0.0;
              auVar72._20_4_ = auVar184._20_4_ * 0.0;
              auVar72._24_4_ = auVar184._24_4_ * 0.0;
              auVar72._28_4_ = auVar184._28_4_;
              auVar122 = vfmadd231ps_fma(auVar72,ZEXT1632(auVar122),local_660);
              auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),ZEXT1632(auVar101),auVar129);
              fVar173 = auVar102._0_4_;
              fVar178 = auVar102._4_4_;
              fVar179 = auVar102._8_4_;
              fVar180 = auVar102._12_4_;
              auVar128 = ZEXT1632(CONCAT412(fVar180 * auVar122._12_4_,
                                            CONCAT48(fVar179 * auVar122._8_4_,
                                                     CONCAT44(fVar178 * auVar122._4_4_,
                                                              fVar173 * auVar122._0_4_))));
              auVar163 = ZEXT3264(auVar128);
              fVar181 = ray->tfar;
              auVar143._4_4_ = fVar181;
              auVar143._0_4_ = fVar181;
              auVar143._8_4_ = fVar181;
              auVar143._12_4_ = fVar181;
              auVar143._16_4_ = fVar181;
              auVar143._20_4_ = fVar181;
              auVar143._24_4_ = fVar181;
              auVar143._28_4_ = fVar181;
              auVar184 = vcmpps_avx(local_380,auVar128,2);
              auVar113 = vcmpps_avx(auVar128,auVar143,2);
              auVar184 = vandps_avx(auVar113,auVar184);
              auVar102 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
              auVar105 = vpand_avx(auVar105,auVar102);
              auVar184 = vpmovsxwd_avx2(auVar105);
              if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar184 >> 0x7f,0) == '\0') &&
                    (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar184 >> 0xbf,0) == '\0') &&
                  (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar184[0x1f]) goto LAB_016174a9;
              auVar184 = vcmpps_avx(ZEXT1632(auVar133),ZEXT832(0) << 0x20,4);
              auVar102 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
              auVar105 = vpand_avx(auVar105,auVar102);
              auVar184 = vpmovsxwd_avx2(auVar105);
              auVar144._8_8_ = uStack_478;
              auVar144._0_8_ = local_480;
              auVar144._16_8_ = uStack_470;
              auVar144._24_8_ = uStack_468;
              auVar194 = ZEXT3264(auVar108);
              if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar184 >> 0x7f,0) != '\0') ||
                    (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0xbf,0) != '\0') ||
                  (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar184[0x1f] < '\0') {
                auVar106 = ZEXT1632(CONCAT412(fVar180 * auVar19._12_4_,
                                              CONCAT48(fVar179 * auVar19._8_4_,
                                                       CONCAT44(fVar178 * auVar19._4_4_,
                                                                fVar173 * auVar19._0_4_))));
                auVar73._28_4_ = SUB84(uStack_468,4);
                auVar73._0_28_ =
                     ZEXT1628(CONCAT412(fVar180 * auVar103._12_4_,
                                        CONCAT48(fVar179 * auVar103._8_4_,
                                                 CONCAT44(fVar178 * auVar103._4_4_,
                                                          fVar173 * auVar103._0_4_))));
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar113 = vsubps_avx(auVar176,auVar106);
                local_700 = vblendvps_avx(auVar113,auVar106,auVar165);
                auVar113 = vsubps_avx(auVar176,auVar73);
                local_3c0 = vblendvps_avx(auVar113,auVar73,auVar165);
                auVar194 = ZEXT3264(auVar128);
                auVar144 = auVar184;
              }
            }
            auVar200 = ZEXT3264(local_6a0);
            auVar189 = ZEXT3264(local_6e0);
            auVar165 = local_560;
            if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar144 >> 0x7f,0) == '\0') &&
                  (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar144 >> 0xbf,0) == '\0') &&
                (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar144[0x1f]) goto LAB_01616fd8;
            auVar184 = vsubps_avx(ZEXT1632(auVar17),auVar166);
            auVar17 = vfmadd213ps_fma(auVar184,local_700,auVar166);
            fVar181 = local_668->depth_scale;
            auVar74._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar181;
            auVar74._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar181;
            auVar74._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar181;
            auVar74._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar181;
            auVar74._16_4_ = fVar181 * 0.0;
            auVar74._20_4_ = fVar181 * 0.0;
            auVar74._24_4_ = fVar181 * 0.0;
            auVar74._28_4_ = fVar181;
            local_220 = auVar194._0_32_;
            auVar184 = vcmpps_avx(local_220,auVar74,6);
            auVar113 = auVar144 & auVar184;
            auVar169 = ZEXT3264(local_560);
            auVar172 = ZEXT3264(CONCAT428(fStack_604,
                                          CONCAT424(fStack_608,
                                                    CONCAT420(fStack_60c,
                                                              CONCAT416(fStack_610,
                                                                        CONCAT412(fStack_614,
                                                                                  CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
            auVar177 = ZEXT3264(local_640);
            if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar113 >> 0x7f,0) == '\0') &&
                  (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0xbf,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar113[0x1f]) {
              auVar131 = ZEXT3264(local_700);
            }
            else {
              auVar130._8_4_ = 0xbf800000;
              auVar130._0_8_ = 0xbf800000bf800000;
              auVar130._12_4_ = 0xbf800000;
              auVar130._16_4_ = 0xbf800000;
              auVar130._20_4_ = 0xbf800000;
              auVar130._24_4_ = 0xbf800000;
              auVar130._28_4_ = 0xbf800000;
              auVar140._8_4_ = 0x40000000;
              auVar140._0_8_ = 0x4000000040000000;
              auVar140._12_4_ = 0x40000000;
              auVar140._16_4_ = 0x40000000;
              auVar140._20_4_ = 0x40000000;
              auVar140._24_4_ = 0x40000000;
              auVar140._28_4_ = 0x40000000;
              auVar17 = vfmadd213ps_fma(local_3c0,auVar140,auVar130);
              auVar163 = ZEXT1664(auVar17);
              local_260 = local_700;
              local_240 = ZEXT1632(auVar17);
              local_1fc = iVar12;
              local_1f0 = local_5e0;
              uStack_1e8 = uStack_5d8;
              local_1e0 = local_5f0;
              uStack_1d8 = uStack_5e8;
              local_1d0 = local_600;
              uStack_1c8 = uStack_5f8;
              pGVar93 = (context->scene->geometries).items[local_670].ptr;
              auVar131 = ZEXT3264(local_700);
              local_3c0 = ZEXT1632(auVar17);
              auVar113 = local_3c0;
              if ((pGVar93->mask & ray->mask) == 0) {
                bVar90 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar90 = 1, pGVar93->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_660._0_8_ = pGVar93;
                local_720 = ZEXT1632(CONCAT88(auVar18._8_8_,context));
                auVar184 = vandps_avx(auVar184,auVar144);
                fVar132 = (float)local_200;
                local_180[0] = (fVar132 + local_700._0_4_ + 0.0) * local_120;
                local_180[1] = (fVar132 + local_700._4_4_ + 1.0) * fStack_11c;
                local_180[2] = (fVar132 + local_700._8_4_ + 2.0) * fStack_118;
                local_180[3] = (fVar132 + local_700._12_4_ + 3.0) * fStack_114;
                fStack_170 = (fVar132 + local_700._16_4_ + 4.0) * fStack_110;
                fStack_16c = (fVar132 + local_700._20_4_ + 5.0) * fStack_10c;
                fStack_168 = (fVar132 + local_700._24_4_ + 6.0) * fStack_108;
                fStack_164 = fVar132 + local_700._28_4_ + 7.0;
                local_3c0._0_8_ = auVar17._0_8_;
                local_3c0._8_8_ = auVar17._8_8_;
                local_160 = local_3c0._0_8_;
                uStack_158 = local_3c0._8_8_;
                uStack_150 = 0;
                uStack_148 = 0;
                local_6c0 = local_220;
                local_140 = local_220;
                uVar91 = vmovmskps_avx(auVar184);
                local_3c0 = auVar113;
                if (uVar91 == 0) {
                  bVar90 = 0;
LAB_016174de:
                  auVar131 = ZEXT3264(local_700);
                  auVar189 = ZEXT3264(local_6e0);
                  auVar194 = ZEXT3264(local_6c0);
                  auVar200 = ZEXT3264(local_6a0);
                  auVar169 = ZEXT3264(local_560);
                  auVar172 = ZEXT3264(CONCAT428(fStack_604,
                                                CONCAT424(fStack_608,
                                                          CONCAT420(fStack_60c,
                                                                    CONCAT416(fStack_610,
                                                                              CONCAT412(fStack_614,
                                                                                        CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                  auVar177 = ZEXT3264(local_640);
                  context = (RayQueryContext *)local_720._0_8_;
                  fVar132 = (float)local_540;
                  fVar115 = local_540._4_4_;
                  fVar116 = (float)uStack_538;
                  fVar117 = uStack_538._4_4_;
                  fVar118 = (float)uStack_530;
                  fVar119 = uStack_530._4_4_;
                  fVar120 = (float)uStack_528;
                }
                else {
                  uVar92 = CONCAT44(0,uVar91 & 0xff);
                  local_740._8_24_ = auVar129._8_24_;
                  local_740._0_8_ = uVar92;
                  lVar24 = 0;
                  for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
                    lVar24 = lVar24 + 1;
                  }
                  local_760 = ZEXT1632(CONCAT88(auVar20._8_8_,lVar24));
                  local_4e0 = ZEXT1632(CONCAT124(auVar16._4_12_,ray->tfar));
                  _local_300 = auVar15;
                  do {
                    local_514 = local_180[local_760._0_8_];
                    local_510 = *(undefined4 *)((long)&local_160 + local_760._0_8_ * 4);
                    ray->tfar = *(float *)(local_140 + local_760._0_8_ * 4);
                    fVar132 = 1.0 - local_514;
                    auVar105 = ZEXT416((uint)local_514);
                    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,
                                              ZEXT416(0xc0a00000));
                    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_514 * local_514 * 3.0)),
                                              ZEXT416((uint)(local_514 + local_514)),auVar20);
                    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar105,
                                              ZEXT416(0x40000000));
                    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132 * -3.0)),
                                              ZEXT416((uint)(fVar132 + fVar132)),auVar20);
                    auVar163 = ZEXT1664(auVar17);
                    auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(local_514 * (fVar132 + fVar132))),
                                               ZEXT416((uint)fVar132),ZEXT416((uint)fVar132));
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_514 * local_514)),auVar105,
                                              ZEXT416((uint)(fVar132 * -2.0)));
                    fVar132 = auVar17._0_4_ * 0.5;
                    fVar115 = auVar20._0_4_ * 0.5;
                    auVar150._0_4_ = fVar115 * local_490;
                    auVar150._4_4_ = fVar115 * fStack_48c;
                    auVar150._8_4_ = fVar115 * fStack_488;
                    auVar150._12_4_ = fVar115 * fStack_484;
                    auVar136._4_4_ = fVar132;
                    auVar136._0_4_ = fVar132;
                    auVar136._8_4_ = fVar132;
                    auVar136._12_4_ = fVar132;
                    auVar81._8_8_ = uStack_5f8;
                    auVar81._0_8_ = local_600;
                    auVar20 = vfmadd132ps_fma(auVar136,auVar150,auVar81);
                    fVar132 = auVar16._0_4_ * 0.5;
                    auVar151._4_4_ = fVar132;
                    auVar151._0_4_ = fVar132;
                    auVar151._8_4_ = fVar132;
                    auVar151._12_4_ = fVar132;
                    auVar83._8_8_ = uStack_5e8;
                    auVar83._0_8_ = local_5f0;
                    auVar20 = vfmadd132ps_fma(auVar151,auVar20,auVar83);
                    fVar132 = auVar18._0_4_ * 0.5;
                    auVar137._4_4_ = fVar132;
                    auVar137._0_4_ = fVar132;
                    auVar137._8_4_ = fVar132;
                    auVar137._12_4_ = fVar132;
                    auVar85._8_8_ = uStack_5d8;
                    auVar85._0_8_ = local_5e0;
                    auVar20 = vfmadd132ps_fma(auVar137,auVar20,auVar85);
                    local_5d0.context = context->user;
                    local_520 = vmovlps_avx(auVar20);
                    local_518 = vextractps_avx(auVar20,2);
                    local_50c = (int)local_4e8;
                    local_508 = (int)local_670;
                    local_504 = (local_5d0.context)->instID[0];
                    local_500 = (local_5d0.context)->instPrimID[0];
                    local_76c = -1;
                    local_5d0.valid = &local_76c;
                    local_5d0.geometryUserPtr = pGVar93->userPtr;
                    local_5d0.ray = (RTCRayN *)ray;
                    local_5d0.hit = (RTCHitN *)&local_520;
                    local_5d0.N = 1;
                    if (pGVar93->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016173a9:
                      pcVar14 = *(code **)(*(byte **)(local_720._0_8_ + 0x10) + 0x10);
                      if ((pcVar14 != (code *)0x0) &&
                         (((**(byte **)(local_720._0_8_ + 0x10) & 2) != 0 ||
                          ((*(byte *)(local_660._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar163 = ZEXT1664(auVar163._0_16_);
                        auVar204 = ZEXT1664(auVar204._0_16_);
                        (*pcVar14)(&local_5d0);
                        if (*local_5d0.valid == 0) goto LAB_016173f4;
                      }
                      bVar90 = 1;
                      goto LAB_016174de;
                    }
                    auVar163 = ZEXT1664(auVar17);
                    auVar204 = ZEXT1664(auVar204._0_16_);
                    (*pGVar93->occlusionFilterN)(&local_5d0);
                    if (*local_5d0.valid != 0) goto LAB_016173a9;
LAB_016173f4:
                    ray->tfar = (float)local_4e0._0_4_;
                    uVar95 = local_740._0_8_ ^ 1L << (local_760._0_8_ & 0x3f);
                    bVar90 = 0;
                    local_740._0_8_ = uVar95;
                    lVar24 = 0;
                    for (uVar92 = uVar95; (uVar92 & 1) == 0;
                        uVar92 = uVar92 >> 1 | 0x8000000000000000) {
                      lVar24 = lVar24 + 1;
                    }
                    local_760._0_8_ = lVar24;
                    auVar131 = ZEXT3264(local_700);
                    auVar189 = ZEXT3264(local_6e0);
                    auVar194 = ZEXT3264(local_6c0);
                    auVar200 = ZEXT3264(local_6a0);
                    auVar169 = ZEXT3264(local_560);
                    auVar172 = ZEXT3264(CONCAT428(fStack_604,
                                                  CONCAT424(fStack_608,
                                                            CONCAT420(fStack_60c,
                                                                      CONCAT416(fStack_610,
                                                                                CONCAT412(fStack_614
                                                                                          ,CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                    auVar177 = ZEXT3264(local_640);
                    pGVar93 = (Geometry *)local_660._0_8_;
                    context = (RayQueryContext *)local_720._0_8_;
                    fVar132 = (float)local_540;
                    fVar115 = local_540._4_4_;
                    fVar116 = (float)uStack_538;
                    fVar117 = uStack_538._4_4_;
                    fVar118 = (float)uStack_530;
                    fVar119 = uStack_530._4_4_;
                    fVar120 = (float)uStack_528;
                  } while (uVar95 != 0);
                }
              }
              bVar96 = (bool)(bVar96 | bVar90);
            }
          }
          local_700 = auVar131._0_32_;
          lVar94 = lVar94 + 8;
          auVar145 = ZEXT3264(local_5a0);
          auVar210 = ZEXT3264(local_4c0);
        } while ((int)lVar94 < iVar12);
      }
      if (bVar96) {
        return bVar96;
      }
      fVar132 = ray->tfar;
      auVar104._4_4_ = fVar132;
      auVar104._0_4_ = fVar132;
      auVar104._8_4_ = fVar132;
      auVar104._12_4_ = fVar132;
      auVar20 = vcmpps_avx(local_280,auVar104,2);
      uVar91 = vmovmskps_avx(auVar20);
      uVar91 = (uint)uVar97 & uVar91;
    } while (uVar91 != 0);
  }
  return bVar96;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }